

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx::forward
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  uint uVar9;
  int *piVar10;
  void *pvVar11;
  void *pvVar12;
  size_t sVar13;
  undefined4 *puVar14;
  void *pvVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  float *pfVar26;
  ulong uVar27;
  ulong uVar28;
  float *pfVar29;
  float *pfVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  float *pfVar39;
  long lVar40;
  undefined1 auVar42 [28];
  undefined1 auVar41 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [64];
  float fVar104;
  __m128 pos;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar151;
  float fVar155;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar107 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 in_ZMM2 [64];
  undefined1 auVar148 [64];
  float fVar156;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  float fVar197;
  undefined1 auVar198 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar199 [32];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  float fVar222;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar226 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar241 [16];
  float in_register_000014dc;
  undefined1 auVar242 [32];
  float fVar243;
  undefined1 auVar244 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar245 [64];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  float fVar257;
  undefined1 auVar258 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar259 [64];
  long local_158;
  int local_148;
  long local_120;
  float *local_108;
  int *piStack_100;
  size_t local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int local_dc;
  undefined8 local_d8;
  int local_d0;
  size_t local_c8;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  Option opt_flatten;
  undefined1 auVar81 [32];
  undefined1 auVar95 [32];
  undefined1 auVar137 [32];
  undefined1 auVar142 [32];
  
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar23 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar23;
  }
  iVar23 = cpu_support_x86_f16c();
  if ((iVar23 != 0) && (opt->use_fp16_storage == true)) {
    iVar23 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar23;
  }
  local_e0 = bottom_blob->dims;
  if (local_e0 == 2) {
    iVar23 = (this->super_InnerProduct).num_output;
    local_dc = bottom_blob->w;
    if (local_dc == (this->super_InnerProduct).weight_data_size / iVar23) {
      Mat::create(top_blob,iVar23,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,opt);
      return 0;
    }
  }
  else {
    local_dc = bottom_blob->w;
  }
  piVar10 = bottom_blob->refcount;
  local_108 = (float *)bottom_blob->data;
  piStack_100 = bottom_blob->refcount;
  local_f8 = bottom_blob->elemsize;
  local_f0 = bottom_blob->elempack;
  local_e8 = bottom_blob->allocator;
  local_d8._0_4_ = bottom_blob->h;
  local_d8._4_4_ = bottom_blob->d;
  local_d0 = bottom_blob->c;
  local_c8 = bottom_blob->cstep;
  iVar23 = local_e0;
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
    iVar23 = bottom_blob->dims;
  }
  local_148 = -100;
  if (iVar23 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_ops = opt->use_subgroup_ops;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.vulkan_device_index = opt->vulkan_device_index;
    opt_flatten.use_reserved_1 = opt->use_reserved_1;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_2 = opt->use_reserved_2;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
    opt_flatten.use_int8_uniform = opt->use_int8_uniform;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
    in_register_000014dc = 0.0;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_108);
    if ((local_108 == (float *)0x0) || ((long)local_d0 * local_c8 == 0)) goto LAB_002d59fa;
  }
  uVar9 = (this->super_InnerProduct).num_output;
  if (opt->use_packing_layout == true) {
    uVar24 = 8;
    if ((uVar9 & 7) != 0) {
      uVar24 = (uint)((uVar9 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar24 = 1;
  }
  Mat::create(top_blob,(int)uVar9 / (int)uVar24,(ulong)uVar24 * (local_f8 / (ulong)(long)local_f0),
              uVar24,opt->blob_allocator);
  pfVar39 = local_108;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar23 = (this->super_InnerProduct).activation_type;
    iVar33 = local_f0 * local_dc;
    iVar37 = top_blob->elempack;
    uVar9 = top_blob->w;
    pvVar11 = (this->super_InnerProduct).bias_data.data;
    if (iVar37 == 1) {
      uVar28 = 0;
      local_88 = (ulong)(uint)((int)uVar9 >> 3);
      if ((int)uVar9 >> 3 < 1) {
        local_88 = uVar28;
      }
      local_b8 = (long)iVar33;
      local_90 = local_b8 * 0x20;
      lVar31 = local_b8 * 4;
      local_120 = local_b8 * 0x18;
      local_158 = local_b8 * 0x1c;
      auVar255 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar196 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar256 = ZEXT864(0);
      lVar34 = local_b8 * 8;
      lVar36 = local_b8 * 0xc;
      lVar35 = local_b8 << 4;
      lVar1 = local_b8 * 0x14;
      for (uVar27 = 0; lVar40 = lVar1, lVar38 = lVar35, lVar32 = lVar36, lVar25 = lVar34,
          uVar27 != local_88; uVar27 = uVar27 + 1) {
        local_80 = uVar27 * 8;
        auVar259 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar243 = 0.0;
        fVar246 = 0.0;
        fVar201 = 0.0;
        fVar202 = 0.0;
        fVar247 = 0.0;
        fVar248 = 0.0;
        fVar249 = 0.0;
        fVar250 = 0.0;
        if (pvVar11 != (void *)0x0) {
          pfVar29 = (float *)((long)pvVar11 + uVar27 * 0x20);
          fVar201 = *pfVar29;
          fVar202 = pfVar29[1];
          fVar243 = pfVar29[2];
          fVar246 = pfVar29[3];
          fVar247 = pfVar29[4];
          fVar248 = pfVar29[5];
          fVar249 = pfVar29[6];
          fVar250 = pfVar29[7];
        }
        pvVar12 = (this->weight_data_tm).data;
        lVar36 = 0;
        lVar34 = 0;
        auVar58 = ZEXT864(0);
        auVar245 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar148 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar173 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar214 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar226 = ZEXT1664(ZEXT816(0) << 0x40);
        iVar37 = 0;
        while( true ) {
          if (iVar33 <= iVar37 + 7) break;
          pfVar30 = (float *)((long)local_108 + lVar34);
          fVar251 = *pfVar30;
          fVar252 = pfVar30[1];
          fVar197 = pfVar30[2];
          fVar200 = pfVar30[3];
          fVar203 = pfVar30[4];
          fVar204 = pfVar30[5];
          fVar205 = pfVar30[6];
          pfVar29 = (float *)((long)pvVar12 + lVar34 + uVar28);
          fVar206 = in_ZMM10._28_4_;
          auVar226 = ZEXT3264(CONCAT428(fVar206 + auVar226._28_4_,
                                        CONCAT424(fVar205 * pfVar29[6] + auVar226._24_4_,
                                                  CONCAT420(fVar204 * pfVar29[5] + auVar226._20_4_,
                                                            CONCAT416(fVar203 * pfVar29[4] +
                                                                      auVar226._16_4_,
                                                                      CONCAT412(fVar200 * pfVar29[3]
                                                                                + auVar226._12_4_,
                                                                                CONCAT48(fVar197 * 
                                                  pfVar29[2] + auVar226._8_4_,
                                                  CONCAT44(fVar252 * pfVar29[1] + auVar226._4_4_,
                                                           fVar251 * *pfVar29 + auVar226._0_4_))))))
                                       ));
          pfVar29 = (float *)((long)pvVar12 + lVar34 + lVar31);
          pfVar26 = (float *)((long)pvVar12 + lVar34 + lVar25);
          auVar214 = ZEXT3264(CONCAT428(fVar206 + auVar214._28_4_,
                                        CONCAT424(fVar205 * pfVar29[6] + auVar214._24_4_,
                                                  CONCAT420(fVar204 * pfVar29[5] + auVar214._20_4_,
                                                            CONCAT416(fVar203 * pfVar29[4] +
                                                                      auVar214._16_4_,
                                                                      CONCAT412(fVar200 * pfVar29[3]
                                                                                + auVar214._12_4_,
                                                                                CONCAT48(fVar197 * 
                                                  pfVar29[2] + auVar214._8_4_,
                                                  CONCAT44(fVar252 * pfVar29[1] + auVar214._4_4_,
                                                           fVar251 * *pfVar29 + auVar214._0_4_))))))
                                       ));
          auVar173 = ZEXT3264(CONCAT428(in_register_000014dc + auVar173._28_4_,
                                        CONCAT424(fVar205 * pfVar26[6] + auVar173._24_4_,
                                                  CONCAT420(fVar204 * pfVar26[5] + auVar173._20_4_,
                                                            CONCAT416(fVar203 * pfVar26[4] +
                                                                      auVar173._16_4_,
                                                                      CONCAT412(fVar200 * pfVar26[3]
                                                                                + auVar173._12_4_,
                                                                                CONCAT48(fVar197 * 
                                                  pfVar26[2] + auVar173._8_4_,
                                                  CONCAT44(fVar252 * pfVar26[1] + auVar173._4_4_,
                                                           fVar251 * *pfVar26 + auVar173._0_4_))))))
                                       ));
          pfVar29 = (float *)((long)pvVar12 + lVar34 + lVar32);
          auVar148 = ZEXT3264(CONCAT428(fVar206 + auVar148._28_4_,
                                        CONCAT424(fVar205 * pfVar29[6] + auVar148._24_4_,
                                                  CONCAT420(fVar204 * pfVar29[5] + auVar148._20_4_,
                                                            CONCAT416(fVar203 * pfVar29[4] +
                                                                      auVar148._16_4_,
                                                                      CONCAT412(fVar200 * pfVar29[3]
                                                                                + auVar148._12_4_,
                                                                                CONCAT48(fVar197 * 
                                                  pfVar29[2] + auVar148._8_4_,
                                                  CONCAT44(fVar252 * pfVar29[1] + auVar148._4_4_,
                                                           fVar251 * *pfVar29 + auVar148._0_4_))))))
                                       ));
          pfVar29 = (float *)((long)pvVar12 + lVar34 + lVar38);
          auVar96 = ZEXT3264(CONCAT428(fVar206 + auVar96._28_4_,
                                       CONCAT424(fVar205 * pfVar29[6] + auVar96._24_4_,
                                                 CONCAT420(fVar204 * pfVar29[5] + auVar96._20_4_,
                                                           CONCAT416(fVar203 * pfVar29[4] +
                                                                     auVar96._16_4_,
                                                                     CONCAT412(fVar200 * pfVar29[3]
                                                                               + auVar96._12_4_,
                                                                               CONCAT48(fVar197 * 
                                                  pfVar29[2] + auVar96._8_4_,
                                                  CONCAT44(fVar252 * pfVar29[1] + auVar96._4_4_,
                                                           fVar251 * *pfVar29 + auVar96._0_4_)))))))
                            );
          pfVar29 = (float *)((long)pvVar12 + lVar34 + lVar40);
          in_ZMM10 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205 * pfVar29[6],
                                                          CONCAT420(fVar204 * pfVar29[5],
                                                                    CONCAT416(fVar203 * pfVar29[4],
                                                                              CONCAT412(fVar200 * 
                                                  pfVar29[3],
                                                  CONCAT48(fVar197 * pfVar29[2],
                                                           CONCAT44(fVar252 * pfVar29[1],
                                                                    fVar251 * *pfVar29))))))));
          pfVar26 = (float *)((long)pvVar12 + lVar34 + local_120);
          auVar245 = ZEXT3264(CONCAT428(fVar206 + auVar245._28_4_,
                                        CONCAT424(fVar205 * pfVar29[6] + auVar245._24_4_,
                                                  CONCAT420(fVar204 * pfVar29[5] + auVar245._20_4_,
                                                            CONCAT416(fVar203 * pfVar29[4] +
                                                                      auVar245._16_4_,
                                                                      CONCAT412(fVar200 * pfVar29[3]
                                                                                + auVar245._12_4_,
                                                                                CONCAT48(fVar197 * 
                                                  pfVar29[2] + auVar245._8_4_,
                                                  CONCAT44(fVar252 * pfVar29[1] + auVar245._4_4_,
                                                           fVar251 * *pfVar29 + auVar245._0_4_))))))
                                       ));
          auVar58 = ZEXT3264(CONCAT428(in_register_000014dc + auVar58._28_4_,
                                       CONCAT424(fVar205 * pfVar26[6] + auVar58._24_4_,
                                                 CONCAT420(fVar204 * pfVar26[5] + auVar58._20_4_,
                                                           CONCAT416(fVar203 * pfVar26[4] +
                                                                     auVar58._16_4_,
                                                                     CONCAT412(fVar200 * pfVar26[3]
                                                                               + auVar58._12_4_,
                                                                               CONCAT48(fVar197 * 
                                                  pfVar26[2] + auVar58._8_4_,
                                                  CONCAT44(fVar252 * pfVar26[1] + auVar58._4_4_,
                                                           fVar251 * *pfVar26 + auVar58._0_4_)))))))
                            );
          pfVar29 = (float *)((long)pvVar12 + lVar34 + local_158);
          auVar259 = ZEXT3264(CONCAT428(pfVar30[7] + auVar259._28_4_,
                                        CONCAT424(fVar205 * pfVar29[6] + auVar259._24_4_,
                                                  CONCAT420(fVar204 * pfVar29[5] + auVar259._20_4_,
                                                            CONCAT416(fVar203 * pfVar29[4] +
                                                                      auVar259._16_4_,
                                                                      CONCAT412(fVar200 * pfVar29[3]
                                                                                + auVar259._12_4_,
                                                                                CONCAT48(fVar197 * 
                                                  pfVar29[2] + auVar259._8_4_,
                                                  CONCAT44(fVar252 * pfVar29[1] + auVar259._4_4_,
                                                           fVar251 * *pfVar29 + auVar259._0_4_))))))
                                       ));
          iVar37 = iVar37 + 8;
          lVar34 = lVar34 + 0x20;
          lVar36 = lVar36 + 8;
        }
        for (; (int)lVar36 < iVar33; lVar36 = lVar36 + 1) {
          auVar106 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar38)),
                                   ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar40)),0x10);
          auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + local_120
                                                             )),0x20);
          auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + local_158
                                                             )),0x30);
          auVar157 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + uVar28)),
                                   ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar31)),0x10);
          auVar157 = vinsertps_avx(auVar157,ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar25)),
                                   0x20);
          auVar157 = vinsertps_avx(auVar157,ZEXT416(*(uint *)((long)pvVar12 + lVar36 * 4 + lVar32)),
                                   0x30);
          in_ZMM10 = ZEXT1664(auVar157);
          in_register_000014dc = local_108[lVar36];
          fVar201 = auVar157._0_4_ * in_register_000014dc + fVar201;
          fVar202 = auVar157._4_4_ * in_register_000014dc + fVar202;
          fVar243 = auVar157._8_4_ * in_register_000014dc + fVar243;
          fVar246 = auVar157._12_4_ * in_register_000014dc + fVar246;
          fVar247 = auVar106._0_4_ * in_register_000014dc + fVar247;
          fVar248 = auVar106._4_4_ * in_register_000014dc + fVar248;
          fVar249 = auVar106._8_4_ * in_register_000014dc + fVar249;
          fVar250 = auVar106._12_4_ + fVar250;
        }
        auVar53 = vhaddps_avx(auVar226._0_32_,auVar214._0_32_);
        auVar253 = vhaddps_avx(auVar173._0_32_,auVar148._0_32_);
        auVar253 = vhaddps_avx(auVar53,auVar253);
        in_ZMM2 = ZEXT3264(auVar253);
        auVar53 = vhaddps_avx(auVar96._0_32_,auVar245._0_32_);
        auVar199 = vhaddps_avx(auVar58._0_32_,auVar259._0_32_);
        auVar199 = vhaddps_avx(auVar53,auVar199);
        auVar53 = vblendps_avx(auVar253,auVar199,0xf0);
        auVar253 = vperm2f128_avx(auVar253,auVar199,0x21);
        fVar201 = auVar253._0_4_ + fVar201 + auVar53._0_4_;
        fVar202 = auVar253._4_4_ + fVar202 + auVar53._4_4_;
        auVar199._0_8_ = CONCAT44(fVar202,fVar201);
        auVar199._8_4_ = auVar253._8_4_ + fVar243 + auVar53._8_4_;
        auVar199._12_4_ = auVar253._12_4_ + fVar246 + auVar53._12_4_;
        auVar199._16_4_ = auVar253._16_4_ + fVar247 + auVar53._16_4_;
        auVar199._20_4_ = auVar253._20_4_ + fVar248 + auVar53._20_4_;
        auVar199._24_4_ = auVar253._24_4_ + fVar249 + auVar53._24_4_;
        auVar199._28_4_ = auVar253._28_4_ + fVar250 + auVar53._28_4_;
        auVar253 = auVar199;
        if (5 < iVar23 - 1U) goto switchD_002d4c58_caseD_1;
        auVar84 = auVar256._0_32_;
        auVar253 = vmaxps_avx(auVar84,auVar199);
        fVar197 = auVar255._0_4_;
        fVar200 = auVar255._4_4_;
        fVar203 = auVar255._8_4_;
        fVar204 = auVar255._12_4_;
        fVar205 = auVar255._16_4_;
        fVar206 = auVar255._20_4_;
        fVar98 = auVar255._24_4_;
        fVar99 = auVar255._28_4_;
        auVar52 = auVar196._0_32_;
        fVar243 = auVar196._0_4_;
        fVar246 = auVar196._4_4_;
        fVar247 = auVar196._8_4_;
        fVar248 = auVar196._12_4_;
        fVar249 = auVar196._16_4_;
        fVar250 = auVar196._20_4_;
        fVar251 = auVar196._24_4_;
        fVar252 = auVar196._28_4_;
        switch(iVar23) {
        case 2:
          auVar53 = vminps_avx(auVar84,auVar199);
          fVar201 = *(this->super_InnerProduct).activation_params.data;
          in_ZMM2 = ZEXT3264(CONCAT428(fVar201,CONCAT424(fVar201,CONCAT420(fVar201,CONCAT416(fVar201
                                                  ,CONCAT412(fVar201,CONCAT48(fVar201,CONCAT44(
                                                  fVar201,fVar201))))))));
          auVar50._0_4_ = fVar201 * auVar53._0_4_ + auVar253._0_4_;
          auVar50._4_4_ = fVar201 * auVar53._4_4_ + auVar253._4_4_;
          auVar50._8_4_ = fVar201 * auVar53._8_4_ + auVar253._8_4_;
          auVar50._12_4_ = fVar201 * auVar53._12_4_ + auVar253._12_4_;
          auVar50._16_4_ = fVar201 * auVar53._16_4_ + auVar253._16_4_;
          auVar50._20_4_ = fVar201 * auVar53._20_4_ + auVar253._20_4_;
          auVar50._24_4_ = fVar201 * auVar53._24_4_ + auVar253._24_4_;
          auVar50._28_4_ = auVar53._28_4_ + auVar253._28_4_;
          auVar253 = auVar50;
          break;
        case 3:
          puVar14 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar8 = *puVar14;
          auVar54._4_4_ = uVar8;
          auVar54._0_4_ = uVar8;
          auVar54._8_4_ = uVar8;
          auVar54._12_4_ = uVar8;
          auVar54._16_4_ = uVar8;
          auVar54._20_4_ = uVar8;
          auVar54._24_4_ = uVar8;
          auVar54._28_4_ = uVar8;
          uVar8 = puVar14[1];
          auVar91._4_4_ = uVar8;
          auVar91._0_4_ = uVar8;
          auVar91._8_4_ = uVar8;
          auVar91._12_4_ = uVar8;
          auVar91._16_4_ = uVar8;
          auVar91._20_4_ = uVar8;
          auVar91._24_4_ = uVar8;
          auVar91._28_4_ = uVar8;
          auVar53 = vmaxps_avx(auVar199,auVar54);
          auVar253 = vminps_avx(auVar53,auVar91);
          break;
        case 4:
          auVar55._0_8_ = auVar199._0_8_ ^ 0x8000000080000000;
          auVar55._8_4_ = -auVar199._8_4_;
          auVar55._12_4_ = -auVar199._12_4_;
          auVar55._16_4_ = -auVar199._16_4_;
          auVar55._20_4_ = -auVar199._20_4_;
          auVar55._24_4_ = -auVar199._24_4_;
          auVar55._28_4_ = -auVar199._28_4_;
          auVar92._8_4_ = 0x42b0c0a5;
          auVar92._0_8_ = 0x42b0c0a542b0c0a5;
          auVar92._12_4_ = 0x42b0c0a5;
          auVar92._16_4_ = 0x42b0c0a5;
          auVar92._20_4_ = 0x42b0c0a5;
          auVar92._24_4_ = 0x42b0c0a5;
          auVar92._28_4_ = 0x42b0c0a5;
          auVar53 = vminps_avx(auVar55,auVar92);
          auVar93._8_4_ = 0xc2b0c0a5;
          auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar93._12_4_ = 0xc2b0c0a5;
          auVar93._16_4_ = 0xc2b0c0a5;
          auVar93._20_4_ = 0xc2b0c0a5;
          auVar93._24_4_ = 0xc2b0c0a5;
          auVar93._28_4_ = 0xc2b0c0a5;
          auVar253 = vmaxps_avx(auVar53,auVar93);
          auVar94._0_4_ = fVar197 + auVar253._0_4_ * 1.442695;
          auVar94._4_4_ = fVar200 + auVar253._4_4_ * 1.442695;
          auVar94._8_4_ = fVar203 + auVar253._8_4_ * 1.442695;
          auVar94._12_4_ = fVar204 + auVar253._12_4_ * 1.442695;
          auVar94._16_4_ = fVar205 + auVar253._16_4_ * 1.442695;
          auVar94._20_4_ = fVar206 + auVar253._20_4_ * 1.442695;
          auVar94._24_4_ = fVar98 + auVar253._24_4_ * 1.442695;
          auVar94._28_4_ = fVar99 + 1.442695;
          auVar199 = vroundps_avx(auVar94,1);
          auVar53 = vcmpps_avx(auVar94,auVar199,1);
          auVar53 = vandps_avx(auVar53,auVar52);
          auVar53 = vsubps_avx(auVar199,auVar53);
          fVar201 = auVar253._0_4_ + auVar53._0_4_ * -0.6931472;
          fVar202 = auVar253._4_4_ + auVar53._4_4_ * -0.6931472;
          fVar99 = auVar253._8_4_ + auVar53._8_4_ * -0.6931472;
          fVar150 = auVar253._12_4_ + auVar53._12_4_ * -0.6931472;
          fVar151 = auVar253._16_4_ + auVar53._16_4_ * -0.6931472;
          fVar175 = auVar253._20_4_ + auVar53._20_4_ * -0.6931472;
          fVar176 = auVar253._24_4_ + auVar53._24_4_ * -0.6931472;
          auVar64._0_4_ = (int)auVar53._0_4_;
          auVar64._4_4_ = (int)auVar53._4_4_;
          auVar64._8_4_ = (int)auVar53._8_4_;
          auVar64._12_4_ = (int)auVar53._12_4_;
          auVar95._16_4_ = (int)auVar53._16_4_;
          auVar95._0_16_ = auVar64;
          auVar95._20_4_ = (int)auVar53._20_4_;
          auVar95._24_4_ = (int)auVar53._24_4_;
          auVar95._28_4_ = (int)auVar53._28_4_;
          auVar157 = vpslld_avx(auVar64,0x17);
          auVar106 = vpslld_avx(auVar95._16_16_,0x17);
          auVar170._8_4_ = 0x3f800000;
          auVar170._0_8_ = 0x3f8000003f800000;
          auVar170._12_4_ = 0x3f800000;
          auVar106 = vpaddd_avx(auVar106,auVar170);
          auVar157 = vpaddd_avx(auVar157,auVar170);
          in_ZMM2 = ZEXT1664(auVar157);
          auVar56._0_4_ =
               (fVar201 + fVar243 +
               fVar201 * fVar201 *
               (fVar197 +
               ((((fVar201 * 0.00019875691 + 0.0013981999) * fVar201 + 0.008333452) * fVar201 +
                0.041665796) * fVar201 + 0.16666666) * fVar201)) * auVar157._0_4_ + fVar243;
          auVar56._4_4_ =
               (fVar202 + fVar246 +
               fVar202 * fVar202 *
               (fVar200 +
               ((((fVar202 * 0.00019875691 + 0.0013981999) * fVar202 + 0.008333452) * fVar202 +
                0.041665796) * fVar202 + 0.16666666) * fVar202)) * auVar157._4_4_ + fVar246;
          auVar56._8_4_ =
               (fVar99 + fVar247 +
               fVar99 * fVar99 *
               (fVar203 +
               ((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99 +
                0.041665796) * fVar99 + 0.16666666) * fVar99)) * auVar157._8_4_ + fVar247;
          auVar56._12_4_ =
               (fVar150 + fVar248 +
               fVar150 * fVar150 *
               (fVar204 +
               ((((fVar150 * 0.00019875691 + 0.0013981999) * fVar150 + 0.008333452) * fVar150 +
                0.041665796) * fVar150 + 0.16666666) * fVar150)) * auVar157._12_4_ + fVar248;
          auVar56._16_4_ =
               (fVar151 + fVar249 +
               fVar151 * fVar151 *
               (fVar205 +
               ((((fVar151 * 0.00019875691 + 0.0013981999) * fVar151 + 0.008333452) * fVar151 +
                0.041665796) * fVar151 + 0.16666666) * fVar151)) * auVar106._0_4_ + fVar249;
          auVar56._20_4_ =
               (fVar175 + fVar250 +
               fVar175 * fVar175 *
               (fVar206 +
               ((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175 +
                0.041665796) * fVar175 + 0.16666666) * fVar175)) * auVar106._4_4_ + fVar250;
          auVar56._24_4_ =
               (fVar176 + fVar251 +
               fVar176 * fVar176 *
               (fVar98 + ((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) *
                           fVar176 + 0.041665796) * fVar176 + 0.16666666) * fVar176)) *
               auVar106._8_4_ + fVar251;
          auVar56._28_4_ = auVar253._28_4_ + -0.6931472 + fVar252 + -0.6931472 + fVar252;
          auVar253 = vdivps_avx(auVar52,auVar56);
          break;
        case 5:
          auVar240._8_4_ = 0x42b0c0a5;
          auVar240._0_8_ = 0x42b0c0a542b0c0a5;
          auVar240._12_4_ = 0x42b0c0a5;
          auVar240._16_4_ = 0x42b0c0a5;
          auVar240._20_4_ = 0x42b0c0a5;
          auVar240._24_4_ = 0x42b0c0a5;
          auVar240._28_4_ = 0x42b0c0a5;
          auVar253 = vminps_avx(auVar240,auVar199);
          auVar242._8_4_ = 0xc2b0c0a5;
          auVar242._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar242._12_4_ = 0xc2b0c0a5;
          auVar242._16_4_ = 0xc2b0c0a5;
          auVar242._20_4_ = 0xc2b0c0a5;
          auVar242._24_4_ = 0xc2b0c0a5;
          auVar242._28_4_ = 0xc2b0c0a5;
          auVar253 = vmaxps_avx(auVar242,auVar253);
          auVar82._0_4_ = fVar197 + auVar253._0_4_ * 1.442695;
          auVar82._4_4_ = fVar200 + auVar253._4_4_ * 1.442695;
          auVar82._8_4_ = fVar203 + auVar253._8_4_ * 1.442695;
          auVar82._12_4_ = fVar204 + auVar253._12_4_ * 1.442695;
          auVar82._16_4_ = fVar205 + auVar253._16_4_ * 1.442695;
          auVar82._20_4_ = fVar206 + auVar253._20_4_ * 1.442695;
          auVar82._24_4_ = fVar98 + auVar253._24_4_ * 1.442695;
          auVar82._28_4_ = fVar99 + auVar53._28_4_;
          auVar84 = vroundps_avx(auVar82,1);
          auVar53 = vcmpps_avx(auVar82,auVar84,1);
          auVar53 = vandps_avx(auVar53,auVar52);
          auVar53 = vsubps_avx(auVar84,auVar53);
          in_register_000014dc = 0.6931472;
          auVar19._4_4_ = auVar53._4_4_ * 0.6931472;
          auVar19._0_4_ = auVar53._0_4_ * 0.6931472;
          auVar19._8_4_ = auVar53._8_4_ * 0.6931472;
          auVar19._12_4_ = auVar53._12_4_ * 0.6931472;
          auVar19._16_4_ = auVar53._16_4_ * 0.6931472;
          auVar19._20_4_ = auVar53._20_4_ * 0.6931472;
          auVar19._24_4_ = auVar53._24_4_ * 0.6931472;
          auVar19._28_4_ = auVar84._28_4_;
          auVar253 = vsubps_avx(auVar253,auVar19);
          fVar150 = auVar253._0_4_;
          fVar151 = auVar253._4_4_;
          fVar175 = auVar253._8_4_;
          fVar176 = auVar253._12_4_;
          fVar216 = auVar253._16_4_;
          fVar217 = auVar253._20_4_;
          fVar228 = auVar253._24_4_;
          auVar106._0_4_ = (int)auVar53._0_4_;
          auVar106._4_4_ = (int)auVar53._4_4_;
          auVar106._8_4_ = (int)auVar53._8_4_;
          auVar106._12_4_ = (int)auVar53._12_4_;
          auVar83._16_4_ = (int)auVar53._16_4_;
          auVar83._0_16_ = auVar106;
          auVar83._20_4_ = (int)auVar53._20_4_;
          auVar83._24_4_ = (int)auVar53._24_4_;
          auVar83._28_4_ = (int)auVar53._28_4_;
          auVar157 = vpslld_avx(auVar106,0x17);
          auVar106 = vpslld_avx(auVar83._16_16_,0x17);
          auVar236._8_4_ = 0x3f800000;
          auVar236._0_8_ = 0x3f8000003f800000;
          auVar236._12_4_ = 0x3f800000;
          auVar106 = vpaddd_avx(auVar236,auVar106);
          auVar157 = vpaddd_avx(auVar236,auVar157);
          auVar51._0_4_ =
               (fVar150 + fVar243 +
               fVar150 * fVar150 *
               (fVar197 +
               ((((fVar150 * 0.00019875691 + 0.0013981999) * fVar150 + 0.008333452) * fVar150 +
                0.041665796) * fVar150 + 0.16666666) * fVar150)) * auVar157._0_4_ + fVar243;
          auVar51._4_4_ =
               (fVar151 + fVar246 +
               fVar151 * fVar151 *
               (fVar200 +
               ((((fVar151 * 0.00019875691 + 0.0013981999) * fVar151 + 0.008333452) * fVar151 +
                0.041665796) * fVar151 + 0.16666666) * fVar151)) * auVar157._4_4_ + fVar246;
          auVar51._8_4_ =
               (fVar175 + fVar247 +
               fVar175 * fVar175 *
               (fVar203 +
               ((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175 +
                0.041665796) * fVar175 + 0.16666666) * fVar175)) * auVar157._8_4_ + fVar247;
          auVar51._12_4_ =
               (fVar176 + fVar248 +
               fVar176 * fVar176 *
               (fVar204 +
               ((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176 +
                0.041665796) * fVar176 + 0.16666666) * fVar176)) * auVar157._12_4_ + fVar248;
          auVar51._16_4_ =
               (fVar216 + fVar249 +
               fVar216 * fVar216 *
               (fVar205 +
               ((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                0.041665796) * fVar216 + 0.16666666) * fVar216)) * auVar106._0_4_ + fVar249;
          auVar51._20_4_ =
               (fVar217 + fVar250 +
               fVar217 * fVar217 *
               (fVar206 +
               ((((fVar217 * 0.00019875691 + 0.0013981999) * fVar217 + 0.008333452) * fVar217 +
                0.041665796) * fVar217 + 0.16666666) * fVar217)) * auVar106._4_4_ + fVar250;
          auVar51._24_4_ =
               (fVar228 + fVar251 +
               fVar228 * fVar228 *
               (fVar98 + ((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) *
                           fVar228 + 0.041665796) * fVar228 + 0.16666666) * fVar228)) *
               auVar106._8_4_ + fVar251;
          auVar51._28_4_ = auVar253._28_4_ + fVar252 + auVar84._28_4_ + fVar252;
          auVar84._8_4_ = 0x800000;
          auVar84._0_8_ = 0x80000000800000;
          auVar84._12_4_ = 0x800000;
          auVar84._16_4_ = 0x800000;
          auVar84._20_4_ = 0x800000;
          auVar84._24_4_ = 0x800000;
          auVar84._28_4_ = 0x800000;
          auVar84 = vmaxps_avx(auVar51,auVar84);
          auVar106 = vpsrld_avx(auVar84._16_16_,0x17);
          auVar85._8_4_ = 0x807fffff;
          auVar85._0_8_ = 0x807fffff807fffff;
          auVar85._12_4_ = 0x807fffff;
          auVar85._16_4_ = 0x807fffff;
          auVar85._20_4_ = 0x807fffff;
          auVar85._24_4_ = 0x807fffff;
          auVar85._28_4_ = 0x807fffff;
          auVar53 = vandps_avx(auVar84,auVar85);
          auVar57 = vorps_avx(auVar255._0_32_,auVar53);
          auVar213._8_4_ = 0x3f3504f3;
          auVar213._0_8_ = 0x3f3504f33f3504f3;
          auVar213._12_4_ = 0x3f3504f3;
          auVar213._16_4_ = 0x3f3504f3;
          auVar213._20_4_ = 0x3f3504f3;
          auVar213._24_4_ = 0x3f3504f3;
          auVar213._28_4_ = 0x3f3504f3;
          auVar253 = vcmpps_avx(auVar213,auVar57,2);
          auVar53 = vandnps_avx(auVar253,auVar57);
          in_ZMM10 = ZEXT3264(CONCAT428(0xbf800000,
                                        CONCAT424(0xbf800000,
                                                  CONCAT420(0xbf800000,
                                                            CONCAT416(0xbf800000,
                                                                      CONCAT412(0xbf800000,
                                                                                CONCAT48(0xbf800000,
                                                                                                                                                                                  
                                                  0xbf800000bf800000)))))));
          fVar150 = auVar53._0_4_ + auVar57._0_4_ + -1.0;
          fVar151 = auVar53._4_4_ + auVar57._4_4_ + -1.0;
          fVar175 = auVar53._8_4_ + auVar57._8_4_ + -1.0;
          fVar176 = auVar53._12_4_ + auVar57._12_4_ + -1.0;
          fVar216 = auVar53._16_4_ + auVar57._16_4_ + -1.0;
          fVar217 = auVar53._20_4_ + auVar57._20_4_ + -1.0;
          fVar228 = auVar53._24_4_ + auVar57._24_4_ + -1.0;
          auVar106 = vpsubd_avx(auVar106,auVar253._16_16_);
          auVar157 = vpsrld_avx(auVar84._0_16_,0x17);
          auVar224._8_4_ = 0xffffff81;
          auVar224._0_8_ = 0xffffff81ffffff81;
          auVar224._12_4_ = 0xffffff81;
          auVar106 = vpaddd_avx(auVar224,auVar106);
          auVar157 = vpsubd_avx(auVar157,auVar253._0_16_);
          auVar157 = vpaddd_avx(auVar224,auVar157);
          auVar146._16_16_ = auVar106;
          auVar146._0_16_ = auVar157;
          auVar253 = vcmpps_avx(auVar51,_DAT_0053ad40,2);
          auVar84 = vcvtdq2ps_avx(auVar146);
          auVar20._4_4_ =
               (auVar84._4_4_ * 0.6931472 + fVar151 +
               fVar151 * fVar151 *
               (((((((((fVar151 * 0.070376836 + -0.1151461) * fVar151 + 0.116769984) * fVar151 +
                     -0.12420141) * fVar151 + 0.14249323) * fVar151 + -0.16668057) * fVar151 +
                  0.20000714) * fVar151 + -0.24999994) * fVar151 + 0.3333333) * fVar151 + -0.5)) *
               -2.0;
          auVar20._0_4_ =
               (auVar84._0_4_ * 0.6931472 + fVar150 +
               fVar150 * fVar150 *
               (((((((((fVar150 * 0.070376836 + -0.1151461) * fVar150 + 0.116769984) * fVar150 +
                     -0.12420141) * fVar150 + 0.14249323) * fVar150 + -0.16668057) * fVar150 +
                  0.20000714) * fVar150 + -0.24999994) * fVar150 + 0.3333333) * fVar150 + -0.5)) *
               -2.0;
          auVar20._8_4_ =
               (auVar84._8_4_ * 0.6931472 + fVar175 +
               fVar175 * fVar175 *
               (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 + 0.116769984) * fVar175 +
                     -0.12420141) * fVar175 + 0.14249323) * fVar175 + -0.16668057) * fVar175 +
                  0.20000714) * fVar175 + -0.24999994) * fVar175 + 0.3333333) * fVar175 + -0.5)) *
               -2.0;
          auVar20._12_4_ =
               (auVar84._12_4_ * 0.6931472 + fVar176 +
               fVar176 * fVar176 *
               (((((((((fVar176 * 0.070376836 + -0.1151461) * fVar176 + 0.116769984) * fVar176 +
                     -0.12420141) * fVar176 + 0.14249323) * fVar176 + -0.16668057) * fVar176 +
                  0.20000714) * fVar176 + -0.24999994) * fVar176 + 0.3333333) * fVar176 + -0.5)) *
               -2.0;
          auVar20._16_4_ =
               (auVar84._16_4_ * 0.6931472 + fVar216 +
               fVar216 * fVar216 *
               (((((((((fVar216 * 0.070376836 + -0.1151461) * fVar216 + 0.116769984) * fVar216 +
                     -0.12420141) * fVar216 + 0.14249323) * fVar216 + -0.16668057) * fVar216 +
                  0.20000714) * fVar216 + -0.24999994) * fVar216 + 0.3333333) * fVar216 + -0.5)) *
               -2.0;
          auVar20._20_4_ =
               (auVar84._20_4_ * 0.6931472 + fVar217 +
               fVar217 * fVar217 *
               (((((((((fVar217 * 0.070376836 + -0.1151461) * fVar217 + 0.116769984) * fVar217 +
                     -0.12420141) * fVar217 + 0.14249323) * fVar217 + -0.16668057) * fVar217 +
                  0.20000714) * fVar217 + -0.24999994) * fVar217 + 0.3333333) * fVar217 + -0.5)) *
               -2.0;
          auVar20._24_4_ =
               (auVar84._24_4_ * 0.6931472 + fVar228 +
               fVar228 * fVar228 *
               (((((((((fVar228 * 0.070376836 + -0.1151461) * fVar228 + 0.116769984) * fVar228 +
                     -0.12420141) * fVar228 + 0.14249323) * fVar228 + -0.16668057) * fVar228 +
                  0.20000714) * fVar228 + -0.24999994) * fVar228 + 0.3333333) * fVar228 + -0.5)) *
               -2.0;
          auVar20._28_4_ = auVar84._28_4_ + auVar53._28_4_ + auVar57._28_4_ + -1.0 + 0.0;
          auVar147._8_4_ = 0x7fffffff;
          auVar147._0_8_ = 0x7fffffff7fffffff;
          auVar147._12_4_ = 0x7fffffff;
          auVar147._16_4_ = 0x7fffffff;
          auVar147._20_4_ = 0x7fffffff;
          auVar147._24_4_ = 0x7fffffff;
          auVar147._28_4_ = 0x7fffffff;
          auVar53 = vblendvps_avx(auVar20,auVar147,auVar253);
          auVar86._8_4_ = 0x42b0c0a5;
          auVar86._0_8_ = 0x42b0c0a542b0c0a5;
          auVar86._12_4_ = 0x42b0c0a5;
          auVar86._16_4_ = 0x42b0c0a5;
          auVar86._20_4_ = 0x42b0c0a5;
          auVar86._24_4_ = 0x42b0c0a5;
          auVar86._28_4_ = 0x42b0c0a5;
          auVar53 = vminps_avx(auVar53,auVar86);
          auVar87._8_4_ = 0xc2b0c0a5;
          auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar87._12_4_ = 0xc2b0c0a5;
          auVar87._16_4_ = 0xc2b0c0a5;
          auVar87._20_4_ = 0xc2b0c0a5;
          auVar87._24_4_ = 0xc2b0c0a5;
          auVar87._28_4_ = 0xc2b0c0a5;
          auVar253 = vmaxps_avx(auVar53,auVar87);
          auVar88._0_4_ = fVar197 + auVar253._0_4_ * 1.442695;
          auVar88._4_4_ = fVar200 + auVar253._4_4_ * 1.442695;
          auVar88._8_4_ = fVar203 + auVar253._8_4_ * 1.442695;
          auVar88._12_4_ = fVar204 + auVar253._12_4_ * 1.442695;
          auVar88._16_4_ = fVar205 + auVar253._16_4_ * 1.442695;
          auVar88._20_4_ = fVar206 + auVar253._20_4_ * 1.442695;
          auVar88._24_4_ = fVar98 + auVar253._24_4_ * 1.442695;
          auVar88._28_4_ = fVar99 + 1.442695;
          auVar84 = vroundps_avx(auVar88,1);
          auVar53 = vcmpps_avx(auVar88,auVar84,1);
          auVar53 = vandps_avx(auVar53,auVar52);
          auVar53 = vsubps_avx(auVar84,auVar53);
          auVar21._4_4_ = auVar53._4_4_ * 0.6931472;
          auVar21._0_4_ = auVar53._0_4_ * 0.6931472;
          auVar21._8_4_ = auVar53._8_4_ * 0.6931472;
          auVar21._12_4_ = auVar53._12_4_ * 0.6931472;
          auVar21._16_4_ = auVar53._16_4_ * 0.6931472;
          auVar21._20_4_ = auVar53._20_4_ * 0.6931472;
          auVar21._24_4_ = auVar53._24_4_ * 0.6931472;
          auVar21._28_4_ = auVar84._28_4_;
          auVar253 = vsubps_avx(auVar253,auVar21);
          fVar99 = auVar253._0_4_;
          fVar150 = auVar253._4_4_;
          fVar151 = auVar253._8_4_;
          fVar175 = auVar253._12_4_;
          fVar176 = auVar253._16_4_;
          fVar216 = auVar253._20_4_;
          fVar217 = auVar253._24_4_;
          auVar255 = ZEXT3264(auVar255._0_32_);
          auVar256 = ZEXT864(0) << 0x20;
          auVar196 = ZEXT3264(auVar52);
          auVar157._0_4_ = (int)auVar53._0_4_;
          auVar157._4_4_ = (int)auVar53._4_4_;
          auVar157._8_4_ = (int)auVar53._8_4_;
          auVar157._12_4_ = (int)auVar53._12_4_;
          auVar89._16_4_ = (int)auVar53._16_4_;
          auVar89._0_16_ = auVar157;
          auVar89._20_4_ = (int)auVar53._20_4_;
          auVar89._24_4_ = (int)auVar53._24_4_;
          auVar89._28_4_ = (int)auVar53._28_4_;
          auVar157 = vpslld_avx(auVar157,0x17);
          auVar106 = vpslld_avx(auVar89._16_16_,0x17);
          auVar106 = vpaddd_avx(auVar236,auVar106);
          auVar157 = vpaddd_avx(auVar236,auVar157);
          in_ZMM2 = ZEXT1664(auVar157);
          auVar52._0_4_ =
               (fVar99 + fVar243 +
               fVar99 * fVar99 *
               (fVar197 +
               ((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99 +
                0.041665796) * fVar99 + 0.16666666) * fVar99)) * auVar157._0_4_ + fVar243;
          auVar52._4_4_ =
               (fVar150 + fVar246 +
               fVar150 * fVar150 *
               (fVar200 +
               ((((fVar150 * 0.00019875691 + 0.0013981999) * fVar150 + 0.008333452) * fVar150 +
                0.041665796) * fVar150 + 0.16666666) * fVar150)) * auVar157._4_4_ + fVar246;
          auVar52._8_4_ =
               (fVar151 + fVar247 +
               fVar151 * fVar151 *
               (fVar203 +
               ((((fVar151 * 0.00019875691 + 0.0013981999) * fVar151 + 0.008333452) * fVar151 +
                0.041665796) * fVar151 + 0.16666666) * fVar151)) * auVar157._8_4_ + fVar247;
          auVar52._12_4_ =
               (fVar175 + fVar248 +
               fVar175 * fVar175 *
               (fVar204 +
               ((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175 +
                0.041665796) * fVar175 + 0.16666666) * fVar175)) * auVar157._12_4_ + fVar248;
          auVar52._16_4_ =
               (fVar176 + fVar249 +
               fVar176 * fVar176 *
               (fVar205 +
               ((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176 +
                0.041665796) * fVar176 + 0.16666666) * fVar176)) * auVar106._0_4_ + fVar249;
          auVar52._20_4_ =
               (fVar216 + fVar250 +
               fVar216 * fVar216 *
               (fVar206 +
               ((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                0.041665796) * fVar216 + 0.16666666) * fVar216)) * auVar106._4_4_ + fVar250;
          auVar52._24_4_ =
               (fVar217 + fVar251 +
               fVar217 * fVar217 *
               (fVar98 + ((((fVar217 * 0.00019875691 + 0.0013981999) * fVar217 + 0.008333452) *
                           fVar217 + 0.041665796) * fVar217 + 0.16666666) * fVar217)) *
               auVar106._8_4_ + fVar251;
          auVar52._28_4_ = auVar253._28_4_ + fVar252 + auVar84._28_4_ + fVar252;
          auVar90._8_4_ = 0x40000000;
          auVar90._0_8_ = 0x4000000040000000;
          auVar90._12_4_ = 0x40000000;
          auVar90._16_4_ = 0x40000000;
          auVar90._20_4_ = 0x40000000;
          auVar90._24_4_ = 0x40000000;
          auVar90._28_4_ = 0x40000000;
          auVar253 = vdivps_avx(auVar90,auVar52);
          auVar53._0_4_ = auVar253._0_4_ + -1.0;
          auVar53._4_4_ = auVar253._4_4_ + -1.0;
          auVar53._8_4_ = auVar253._8_4_ + -1.0;
          auVar53._12_4_ = auVar253._12_4_ + -1.0;
          auVar53._16_4_ = auVar253._16_4_ + -1.0;
          auVar53._20_4_ = auVar253._20_4_ + -1.0;
          auVar53._24_4_ = auVar253._24_4_ + -1.0;
          auVar53._28_4_ = auVar253._28_4_ + -1.0;
          goto LAB_002d50cd;
        case 6:
          pfVar29 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar243 = *pfVar29;
          fVar246 = pfVar29[1];
          auVar57._0_4_ = fVar243 * fVar201 + fVar246;
          auVar57._4_4_ = fVar243 * fVar202 + fVar246;
          auVar57._8_4_ = fVar243 * auVar199._8_4_ + fVar246;
          auVar57._12_4_ = fVar243 * auVar199._12_4_ + fVar246;
          auVar57._16_4_ = fVar243 * auVar199._16_4_ + fVar246;
          auVar57._20_4_ = fVar243 * auVar199._20_4_ + fVar246;
          auVar57._24_4_ = fVar243 * auVar199._24_4_ + fVar246;
          auVar57._28_4_ = fVar243 + fVar246;
          auVar53 = vmaxps_avx(auVar84,auVar57);
          auVar53 = vminps_avx(auVar53,auVar52);
LAB_002d50cd:
          auVar253._4_4_ = auVar53._4_4_ * fVar202;
          auVar253._0_4_ = auVar53._0_4_ * fVar201;
          auVar253._8_4_ = auVar53._8_4_ * auVar199._8_4_;
          auVar253._12_4_ = auVar53._12_4_ * auVar199._12_4_;
          auVar253._16_4_ = auVar53._16_4_ * auVar199._16_4_;
          auVar253._20_4_ = auVar53._20_4_ * auVar199._20_4_;
          auVar253._24_4_ = auVar53._24_4_ * auVar199._24_4_;
          auVar253._28_4_ = auVar53._28_4_;
        }
switchD_002d4c58_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar27 * 0x20) = auVar253;
        uVar28 = uVar28 + local_90;
        lVar31 = lVar31 + local_90;
        local_120 = local_120 + local_90;
        local_158 = local_158 + local_90;
        lVar34 = lVar25 + local_90;
        lVar36 = lVar32 + local_90;
        lVar35 = lVar38 + local_90;
        lVar1 = lVar40 + local_90;
        local_b0 = lVar40;
        local_a8 = lVar38;
        local_a0 = lVar32;
        local_98 = lVar25;
      }
      uVar28 = (long)(int)uVar9 & 0xfffffffffffffff8;
      uVar24 = uVar9 >> 2 & 1;
      lVar36 = local_b8 * uVar28 * 4;
      lVar34 = local_b8 * 0x10;
      lVar31 = (uVar28 + 1) * local_b8 * 4;
      local_120 = (uVar28 + 2) * local_b8 * 4;
      lVar35 = (uVar28 + 3) * local_b8 * 4;
      auVar255 = ZEXT864(0);
      auVar256 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      for (uVar27 = 0; uVar27 != uVar24; uVar27 = uVar27 + 1) {
        lVar1 = uVar28 + uVar27 * 4;
        if (pvVar11 == (void *)0x0) {
          fVar201 = 0.0;
          fVar202 = 0.0;
          fVar243 = 0.0;
          fVar246 = 0.0;
        }
        else {
          pfVar29 = (float *)((long)pvVar11 + lVar1 * 4);
          fVar201 = *pfVar29;
          fVar202 = pfVar29[1];
          fVar243 = pfVar29[2];
          fVar246 = pfVar29[3];
        }
        pvVar12 = (this->weight_data_tm).data;
        lVar32 = 0;
        auVar148 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar25 = 0;
        auVar259 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
        for (iVar37 = 0; iVar37 + 7 < iVar33; iVar37 = iVar37 + 8) {
          pfVar29 = (float *)((long)local_108 + lVar25);
          fVar248 = *pfVar29;
          fVar249 = pfVar29[1];
          fVar250 = pfVar29[2];
          fVar251 = pfVar29[3];
          fVar252 = pfVar29[4];
          fVar197 = pfVar29[5];
          fVar200 = pfVar29[6];
          pfVar26 = (float *)((long)pvVar12 + lVar25 + lVar36);
          fVar247 = in_ZMM2._28_4_;
          auVar148 = ZEXT3264(CONCAT428(auVar148._28_4_ + fVar247,
                                        CONCAT424(auVar148._24_4_ + fVar200 * pfVar26[6],
                                                  CONCAT420(auVar148._20_4_ + fVar197 * pfVar26[5],
                                                            CONCAT416(auVar148._16_4_ +
                                                                      fVar252 * pfVar26[4],
                                                                      CONCAT412(auVar148._12_4_ +
                                                                                fVar251 * pfVar26[3]
                                                                                ,CONCAT48(auVar148.
                                                  _8_4_ + fVar250 * pfVar26[2],
                                                  CONCAT44(auVar148._4_4_ + fVar249 * pfVar26[1],
                                                           auVar148._0_4_ + fVar248 * *pfVar26))))))
                                       ));
          pfVar26 = (float *)((long)pvVar12 + lVar25 + lVar31);
          in_ZMM2 = ZEXT3264(CONCAT428(fVar247,CONCAT424(fVar200 * pfVar26[6],
                                                         CONCAT420(fVar197 * pfVar26[5],
                                                                   CONCAT416(fVar252 * pfVar26[4],
                                                                             CONCAT412(fVar251 * 
                                                  pfVar26[3],
                                                  CONCAT48(fVar250 * pfVar26[2],
                                                           CONCAT44(fVar249 * pfVar26[1],
                                                                    fVar248 * *pfVar26))))))));
          pfVar30 = (float *)((long)pvVar12 + lVar25 + local_120);
          auVar173._0_4_ = fVar248 * *pfVar30;
          auVar173._4_4_ = fVar249 * pfVar30[1];
          auVar173._8_4_ = fVar250 * pfVar30[2];
          auVar173._12_4_ = fVar251 * pfVar30[3];
          auVar173._16_4_ = fVar252 * pfVar30[4];
          auVar173._20_4_ = fVar197 * pfVar30[5];
          auVar173._28_36_ = auVar196._28_36_;
          auVar173._24_4_ = fVar200 * pfVar30[6];
          auVar259 = ZEXT3264(CONCAT428(fVar247 + auVar259._28_4_,
                                        CONCAT424(fVar200 * pfVar26[6] + auVar259._24_4_,
                                                  CONCAT420(fVar197 * pfVar26[5] + auVar259._20_4_,
                                                            CONCAT416(fVar252 * pfVar26[4] +
                                                                      auVar259._16_4_,
                                                                      CONCAT412(fVar251 * pfVar26[3]
                                                                                + auVar259._12_4_,
                                                                                CONCAT48(fVar250 * 
                                                  pfVar26[2] + auVar259._8_4_,
                                                  CONCAT44(fVar249 * pfVar26[1] + auVar259._4_4_,
                                                           fVar248 * *pfVar26 + auVar259._0_4_))))))
                                       ));
          auVar58 = ZEXT3264(CONCAT428(auVar58._28_4_ + auVar196._28_4_,
                                       CONCAT424(auVar58._24_4_ + auVar173._24_4_,
                                                 CONCAT420(auVar58._20_4_ + auVar173._20_4_,
                                                           CONCAT416(auVar58._16_4_ +
                                                                     auVar173._16_4_,
                                                                     CONCAT412(auVar58._12_4_ +
                                                                               auVar173._12_4_,
                                                                               CONCAT48(auVar58.
                                                  _8_4_ + auVar173._8_4_,
                                                  CONCAT44(auVar58._4_4_ + auVar173._4_4_,
                                                           auVar58._0_4_ + auVar173._0_4_))))))));
          pfVar26 = (float *)((long)pvVar12 + lVar25 + lVar35);
          auVar96 = ZEXT3264(CONCAT428(auVar96._28_4_ + pfVar29[7],
                                       CONCAT424(auVar96._24_4_ + fVar200 * pfVar26[6],
                                                 CONCAT420(auVar96._20_4_ + fVar197 * pfVar26[5],
                                                           CONCAT416(auVar96._16_4_ +
                                                                     fVar252 * pfVar26[4],
                                                                     CONCAT412(auVar96._12_4_ +
                                                                               fVar251 * pfVar26[3],
                                                                               CONCAT48(auVar96.
                                                  _8_4_ + fVar250 * pfVar26[2],
                                                  CONCAT44(auVar96._4_4_ + fVar249 * pfVar26[1],
                                                           auVar96._0_4_ + fVar248 * *pfVar26)))))))
                            );
          lVar25 = lVar25 + 0x20;
          lVar32 = lVar32 + 8;
          auVar196 = ZEXT3264(auVar173._0_32_);
        }
        auVar106 = ZEXT816(0) << 0x40;
        auVar157 = ZEXT816(0) << 0x40;
        auVar224 = ZEXT816(0) << 0x40;
        auVar236 = ZEXT816(0) << 0x40;
        for (; iVar37 + 3 < iVar33; iVar37 = iVar37 + 4) {
          pfVar29 = (float *)((long)local_108 + lVar25);
          fVar247 = *pfVar29;
          fVar248 = pfVar29[1];
          fVar249 = pfVar29[2];
          fVar250 = pfVar29[3];
          pfVar29 = (float *)((long)pvVar12 + lVar25 + lVar36);
          auVar258._0_4_ = auVar236._0_4_ + fVar247 * *pfVar29;
          auVar258._4_4_ = auVar236._4_4_ + fVar248 * pfVar29[1];
          auVar258._8_4_ = auVar236._8_4_ + fVar249 * pfVar29[2];
          auVar258._12_4_ = auVar236._12_4_ + fVar250 * pfVar29[3];
          pfVar29 = (float *)((long)pvVar12 + lVar25 + lVar31);
          pfVar26 = (float *)((long)pvVar12 + lVar25 + local_120);
          auVar65._0_4_ = fVar247 * *pfVar29 + auVar106._0_4_;
          auVar65._4_4_ = fVar248 * pfVar29[1] + auVar106._4_4_;
          auVar65._8_4_ = fVar249 * pfVar29[2] + auVar106._8_4_;
          auVar65._12_4_ = fVar250 * pfVar29[3] + auVar106._12_4_;
          auVar119._0_4_ = fVar247 * *pfVar26 + auVar157._0_4_;
          auVar119._4_4_ = fVar248 * pfVar26[1] + auVar157._4_4_;
          auVar119._8_4_ = fVar249 * pfVar26[2] + auVar157._8_4_;
          auVar119._12_4_ = fVar250 * pfVar26[3] + auVar157._12_4_;
          pfVar29 = (float *)((long)pvVar12 + lVar25 + lVar35);
          auVar192._0_4_ = fVar247 * *pfVar29 + auVar224._0_4_;
          auVar192._4_4_ = fVar248 * pfVar29[1] + auVar224._4_4_;
          auVar192._8_4_ = fVar249 * pfVar29[2] + auVar224._8_4_;
          auVar192._12_4_ = fVar250 * pfVar29[3] + auVar224._12_4_;
          lVar25 = lVar25 + 0x10;
          lVar32 = lVar32 + 4;
          auVar106 = auVar65;
          auVar157 = auVar119;
          auVar224 = auVar192;
          auVar236 = auVar258;
        }
        for (; (int)lVar32 < iVar33; lVar32 = lVar32 + 1) {
          auVar64 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar12 + lVar32 * 4 + lVar36)),
                                  ZEXT416(*(uint *)((long)pvVar12 + lVar32 * 4 + lVar31)),0x10);
          auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)((long)pvVar12 + lVar32 * 4 + local_120))
                                  ,0x20);
          auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)((long)pvVar12 + lVar32 * 4 + lVar35)),
                                  0x30);
          fVar247 = local_108[lVar32];
          fVar201 = fVar201 + auVar64._0_4_ * fVar247;
          fVar202 = fVar202 + auVar64._4_4_ * fVar247;
          fVar243 = fVar243 + auVar64._8_4_ * fVar247;
          fVar246 = fVar246 + auVar64._12_4_ * fVar247;
        }
        auVar53 = vhaddps_avx(auVar148._0_32_,auVar259._0_32_);
        auVar253 = vhaddps_avx(auVar58._0_32_,auVar96._0_32_);
        auVar53 = vhaddps_avx(auVar53,auVar253);
        auVar64 = vunpcklps_avx(auVar236,auVar106);
        auVar170 = vunpcklps_avx(auVar157,auVar224);
        auVar236 = vunpckhps_avx(auVar236,auVar106);
        auVar224 = vunpckhps_avx(auVar157,auVar224);
        in_ZMM2 = ZEXT1664(auVar224);
        auVar106 = vmovlhps_avx(auVar64,auVar170);
        auVar157 = vunpckhpd_avx(auVar64,auVar170);
        fVar247 = auVar157._0_4_ + auVar106._0_4_;
        fVar248 = auVar157._4_4_ + auVar106._4_4_;
        fVar249 = auVar157._8_4_ + auVar106._8_4_;
        fVar250 = auVar157._12_4_ + auVar106._12_4_;
        auVar196 = ZEXT1664(CONCAT412(fVar250,CONCAT48(fVar249,CONCAT44(fVar248,fVar247))));
        auVar106 = vmovlhps_avx(auVar236,auVar224);
        auVar157 = vunpckhpd_avx(auVar236,auVar224);
        auVar244._0_4_ =
             fVar201 + fVar247 + auVar106._0_4_ + auVar157._0_4_ + auVar53._0_4_ + auVar53._16_4_;
        auVar244._4_4_ =
             fVar202 + fVar248 + auVar106._4_4_ + auVar157._4_4_ + auVar53._4_4_ + auVar53._20_4_;
        auVar244._8_4_ =
             fVar243 + fVar249 + auVar106._8_4_ + auVar157._8_4_ + auVar53._8_4_ + auVar53._24_4_;
        auVar244._12_4_ =
             fVar246 + fVar250 + auVar106._12_4_ + auVar157._12_4_ + auVar53._12_4_ + auVar53._28_4_
        ;
        auVar74 = auVar244;
        if (5 < iVar23 - 1U) goto switchD_002d537a_caseD_1;
        auVar106 = auVar255._0_16_;
        auVar74 = vmaxps_avx(auVar244,auVar106);
        fVar201 = auVar256._0_4_;
        fVar202 = auVar256._4_4_;
        fVar243 = auVar256._8_4_;
        fVar246 = auVar256._12_4_;
        switch(iVar23) {
        case 2:
          auVar106 = vminps_avx(auVar244,auVar106);
          fVar201 = *(this->super_InnerProduct).activation_params.data;
          fVar202 = fVar201 * auVar106._0_4_;
          fVar243 = fVar201 * auVar106._4_4_;
          fVar246 = fVar201 * auVar106._8_4_;
          fVar201 = fVar201 * auVar106._12_4_;
          in_ZMM2 = ZEXT1664(CONCAT412(fVar201,CONCAT48(fVar246,CONCAT44(fVar243,fVar202))));
          auVar66._0_4_ = fVar202 + auVar74._0_4_;
          auVar66._4_4_ = fVar243 + auVar74._4_4_;
          auVar66._8_4_ = fVar246 + auVar74._8_4_;
          auVar66._12_4_ = fVar201 + auVar74._12_4_;
          auVar74 = auVar66;
          break;
        case 3:
          puVar14 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar8 = *puVar14;
          auVar70._4_4_ = uVar8;
          auVar70._0_4_ = uVar8;
          auVar70._8_4_ = uVar8;
          auVar70._12_4_ = uVar8;
          uVar8 = puVar14[1];
          auVar128._4_4_ = uVar8;
          auVar128._0_4_ = uVar8;
          auVar128._8_4_ = uVar8;
          auVar128._12_4_ = uVar8;
          in_ZMM2 = ZEXT1664(auVar128);
          auVar106 = vmaxps_avx(auVar244,auVar70);
          auVar74 = vminps_avx(auVar106,auVar128);
          break;
        case 4:
          uVar22 = CONCAT44(auVar244._4_4_,auVar244._0_4_);
          auVar71._0_8_ = uVar22 ^ 0x8000000080000000;
          auVar71._8_4_ = -auVar244._8_4_;
          auVar71._12_4_ = -auVar244._12_4_;
          auVar129._8_4_ = 0x42b0c0a5;
          auVar129._0_8_ = 0x42b0c0a542b0c0a5;
          auVar129._12_4_ = 0x42b0c0a5;
          auVar106 = vminps_avx(auVar71,auVar129);
          auVar130._8_4_ = 0xc2b0c0a5;
          auVar130._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar130._12_4_ = 0xc2b0c0a5;
          auVar224 = vmaxps_avx(auVar106,auVar130);
          auVar131._0_4_ = fVar201 + auVar224._0_4_ * 1.442695;
          auVar131._4_4_ = fVar202 + auVar224._4_4_ * 1.442695;
          auVar131._8_4_ = fVar243 + auVar224._8_4_ * 1.442695;
          auVar131._12_4_ = fVar246 + auVar224._12_4_ * 1.442695;
          auVar191._0_4_ = (int)auVar131._0_4_;
          auVar191._4_4_ = (int)auVar131._4_4_;
          auVar191._8_4_ = (int)auVar131._8_4_;
          auVar191._12_4_ = (int)auVar131._12_4_;
          auVar157 = vcvtdq2ps_avx(auVar191);
          auVar106 = vcmpps_avx(auVar131,auVar157,1);
          auVar198._8_4_ = 0x3f800000;
          auVar198._0_8_ = 0x3f8000003f800000;
          auVar198._12_4_ = 0x3f800000;
          auVar106 = vandps_avx(auVar106,auVar198);
          auVar106 = vsubps_avx(auVar157,auVar106);
          fVar247 = auVar224._0_4_ + auVar106._0_4_ * -0.6931472;
          fVar248 = auVar224._4_4_ + auVar106._4_4_ * -0.6931472;
          fVar249 = auVar224._8_4_ + auVar106._8_4_ * -0.6931472;
          fVar250 = auVar224._12_4_ + auVar106._12_4_ * -0.6931472;
          fVar201 = fVar201 + ((((fVar247 * 0.00019875691 + 0.0013981999) * fVar247 + 0.008333452) *
                                fVar247 + 0.041665796) * fVar247 + 0.16666666) * fVar247;
          fVar202 = fVar202 + ((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) *
                                fVar248 + 0.041665796) * fVar248 + 0.16666666) * fVar248;
          fVar243 = fVar243 + ((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) *
                                fVar249 + 0.041665796) * fVar249 + 0.16666666) * fVar249;
          fVar246 = fVar246 + ((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 + 0.008333452) *
                                fVar250 + 0.041665796) * fVar250 + 0.16666666) * fVar250;
          auVar196 = ZEXT1664(CONCAT412(fVar246,CONCAT48(fVar243,CONCAT44(fVar202,fVar201))));
          auVar132._0_4_ = (int)auVar106._0_4_;
          auVar132._4_4_ = (int)auVar106._4_4_;
          auVar132._8_4_ = (int)auVar106._8_4_;
          auVar132._12_4_ = (int)auVar106._12_4_;
          auVar106 = vpslld_avx(auVar132,0x17);
          auVar106 = vpaddd_avx(auVar106,auVar198);
          in_ZMM2 = ZEXT1664(auVar106);
          auVar72._0_4_ = (fVar247 + 1.0 + fVar247 * fVar247 * fVar201) * auVar106._0_4_ + 1.0;
          auVar72._4_4_ = (fVar248 + 1.0 + fVar248 * fVar248 * fVar202) * auVar106._4_4_ + 1.0;
          auVar72._8_4_ = (fVar249 + 1.0 + fVar249 * fVar249 * fVar243) * auVar106._8_4_ + 1.0;
          auVar72._12_4_ = (fVar250 + 1.0 + fVar250 * fVar250 * fVar246) * auVar106._12_4_ + 1.0;
          auVar74 = vdivps_avx(auVar198,auVar72);
          break;
        case 5:
          auVar225._8_4_ = 0x42b0c0a5;
          auVar225._0_8_ = 0x42b0c0a542b0c0a5;
          auVar225._12_4_ = 0x42b0c0a5;
          auVar106 = vminps_avx(auVar244,auVar225);
          auVar241._8_4_ = 0xc2b0c0a5;
          auVar241._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar241._12_4_ = 0xc2b0c0a5;
          auVar224 = vmaxps_avx(auVar241,auVar106);
          auVar120._0_4_ = fVar201 + auVar224._0_4_ * 1.442695;
          auVar120._4_4_ = fVar202 + auVar224._4_4_ * 1.442695;
          auVar120._8_4_ = fVar243 + auVar224._8_4_ * 1.442695;
          auVar120._12_4_ = fVar246 + auVar224._12_4_ * 1.442695;
          auVar186._0_4_ = (int)auVar120._0_4_;
          auVar186._4_4_ = (int)auVar120._4_4_;
          auVar186._8_4_ = (int)auVar120._8_4_;
          auVar186._12_4_ = (int)auVar120._12_4_;
          auVar157 = vcvtdq2ps_avx(auVar186);
          auVar106 = vcmpps_avx(auVar120,auVar157,1);
          auVar211._8_4_ = 0x3f800000;
          auVar211._0_8_ = 0x3f8000003f800000;
          auVar211._12_4_ = 0x3f800000;
          auVar106 = vandps_avx(auVar106,auVar211);
          auVar106 = vsubps_avx(auVar157,auVar106);
          auVar187._0_4_ = auVar106._0_4_ * 0.6931472;
          auVar187._4_4_ = auVar106._4_4_ * 0.6931472;
          auVar187._8_4_ = auVar106._8_4_ * 0.6931472;
          auVar187._12_4_ = auVar106._12_4_ * 0.6931472;
          auVar157 = vsubps_avx(auVar224,auVar187);
          fVar247 = auVar157._0_4_;
          fVar248 = auVar157._4_4_;
          fVar249 = auVar157._8_4_;
          fVar250 = auVar157._12_4_;
          auVar121._0_4_ = (int)auVar106._0_4_;
          auVar121._4_4_ = (int)auVar106._4_4_;
          auVar121._8_4_ = (int)auVar106._8_4_;
          auVar121._12_4_ = (int)auVar106._12_4_;
          auVar106 = vpslld_avx(auVar121,0x17);
          auVar106 = vpaddd_avx(auVar106,auVar211);
          auVar67._0_4_ =
               (fVar247 + 1.0 +
               fVar247 * fVar247 *
               (((((fVar247 * 0.00019875691 + 0.0013981999) * fVar247 + 0.008333452) * fVar247 +
                 0.041665796) * fVar247 + 0.16666666) * fVar247 + fVar201)) * auVar106._0_4_ + 1.0;
          auVar67._4_4_ =
               (fVar248 + 1.0 +
               fVar248 * fVar248 *
               (((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) * fVar248 +
                 0.041665796) * fVar248 + 0.16666666) * fVar248 + fVar202)) * auVar106._4_4_ + 1.0;
          auVar67._8_4_ =
               (fVar249 + 1.0 +
               fVar249 * fVar249 *
               (((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) * fVar249 +
                 0.041665796) * fVar249 + 0.16666666) * fVar249 + fVar243)) * auVar106._8_4_ + 1.0;
          auVar67._12_4_ =
               (fVar250 + 1.0 +
               fVar250 * fVar250 *
               (((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 + 0.008333452) * fVar250 +
                 0.041665796) * fVar250 + 0.16666666) * fVar250 + fVar246)) * auVar106._12_4_ + 1.0;
          auVar122._8_4_ = 0x800000;
          auVar122._0_8_ = 0x80000000800000;
          auVar122._12_4_ = 0x800000;
          auVar106 = vmaxps_avx(auVar67,auVar122);
          auVar157 = vpsrld_avx(auVar106,0x17);
          auVar193._8_4_ = 0xffffff82;
          auVar193._0_8_ = 0xffffff82ffffff82;
          auVar193._12_4_ = 0xffffff82;
          auVar157 = vpaddd_avx(auVar157,auVar193);
          auVar194._8_4_ = 0x807fffff;
          auVar194._0_8_ = 0x807fffff807fffff;
          auVar194._12_4_ = 0x807fffff;
          auVar106 = vandps_avx(auVar106,auVar194);
          auVar236 = vorps_avx(auVar106,auVar256._0_16_);
          auVar224 = vcvtdq2ps_avx(auVar157);
          auVar195._8_4_ = 0x3f3504f3;
          auVar195._0_8_ = 0x3f3504f33f3504f3;
          auVar195._12_4_ = 0x3f3504f3;
          auVar157 = vcmpps_avx(auVar236,auVar195,1);
          auVar106 = vandps_avx(auVar157,auVar236);
          fVar247 = auVar236._0_4_ + -1.0 + auVar106._0_4_;
          fVar248 = auVar236._4_4_ + -1.0 + auVar106._4_4_;
          fVar249 = auVar236._8_4_ + -1.0 + auVar106._8_4_;
          fVar250 = auVar236._12_4_ + -1.0 + auVar106._12_4_;
          auVar106 = vandps_avx(auVar157,auVar211);
          auVar157 = vsubps_avx(auVar224,auVar106);
          auVar106 = vcmpps_avx(auVar67,_DAT_005370d0,2);
          auVar123._0_4_ =
               (auVar157._0_4_ * 0.6931472 + fVar247 +
               fVar247 * fVar247 *
               (((((((((fVar247 * 0.070376836 + -0.1151461) * fVar247 + 0.116769984) * fVar247 +
                     -0.12420141) * fVar247 + 0.14249323) * fVar247 + -0.16668057) * fVar247 +
                  0.20000714) * fVar247 + -0.24999994) * fVar247 + 0.3333333) * fVar247 + -0.5)) *
               -2.0;
          auVar123._4_4_ =
               (auVar157._4_4_ * 0.6931472 + fVar248 +
               fVar248 * fVar248 *
               (((((((((fVar248 * 0.070376836 + -0.1151461) * fVar248 + 0.116769984) * fVar248 +
                     -0.12420141) * fVar248 + 0.14249323) * fVar248 + -0.16668057) * fVar248 +
                  0.20000714) * fVar248 + -0.24999994) * fVar248 + 0.3333333) * fVar248 + -0.5)) *
               -2.0;
          auVar123._8_4_ =
               (auVar157._8_4_ * 0.6931472 + fVar249 +
               fVar249 * fVar249 *
               (((((((((fVar249 * 0.070376836 + -0.1151461) * fVar249 + 0.116769984) * fVar249 +
                     -0.12420141) * fVar249 + 0.14249323) * fVar249 + -0.16668057) * fVar249 +
                  0.20000714) * fVar249 + -0.24999994) * fVar249 + 0.3333333) * fVar249 + -0.5)) *
               -2.0;
          auVar123._12_4_ =
               (auVar157._12_4_ * 0.6931472 + fVar250 +
               fVar250 * fVar250 *
               (((((((((fVar250 * 0.070376836 + -0.1151461) * fVar250 + 0.116769984) * fVar250 +
                     -0.12420141) * fVar250 + 0.14249323) * fVar250 + -0.16668057) * fVar250 +
                  0.20000714) * fVar250 + -0.24999994) * fVar250 + 0.3333333) * fVar250 + -0.5)) *
               -2.0;
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar106 = vblendvps_avx(auVar123,auVar188,auVar106);
          auVar124._8_4_ = 0x42b0c0a5;
          auVar124._0_8_ = 0x42b0c0a542b0c0a5;
          auVar124._12_4_ = 0x42b0c0a5;
          auVar106 = vminps_avx(auVar106,auVar124);
          auVar224 = vmaxps_avx(auVar241,auVar106);
          auVar125._0_4_ = auVar224._0_4_ * 1.442695 + fVar201;
          auVar125._4_4_ = auVar224._4_4_ * 1.442695 + fVar202;
          auVar125._8_4_ = auVar224._8_4_ * 1.442695 + fVar243;
          auVar125._12_4_ = auVar224._12_4_ * 1.442695 + fVar246;
          auVar189._0_4_ = (int)auVar125._0_4_;
          auVar189._4_4_ = (int)auVar125._4_4_;
          auVar189._8_4_ = (int)auVar125._8_4_;
          auVar189._12_4_ = (int)auVar125._12_4_;
          auVar157 = vcvtdq2ps_avx(auVar189);
          auVar106 = vcmpps_avx(auVar125,auVar157,1);
          auVar106 = vandps_avx(auVar106,auVar211);
          auVar106 = vsubps_avx(auVar157,auVar106);
          auVar190._0_4_ = auVar106._0_4_ * 0.6931472;
          auVar190._4_4_ = auVar106._4_4_ * 0.6931472;
          auVar190._8_4_ = auVar106._8_4_ * 0.6931472;
          auVar190._12_4_ = auVar106._12_4_ * 0.6931472;
          auVar157 = vsubps_avx(auVar224,auVar190);
          fVar247 = auVar157._0_4_;
          fVar248 = auVar157._4_4_;
          fVar249 = auVar157._8_4_;
          fVar250 = auVar157._12_4_;
          auVar256 = ZEXT1664(auVar256._0_16_);
          auVar255 = ZEXT864(0) << 0x20;
          fVar201 = fVar201 + ((((fVar247 * 0.00019875691 + 0.0013981999) * fVar247 + 0.008333452) *
                                fVar247 + 0.041665796) * fVar247 + 0.16666666) * fVar247;
          fVar202 = fVar202 + ((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) *
                                fVar248 + 0.041665796) * fVar248 + 0.16666666) * fVar248;
          fVar243 = fVar243 + ((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) *
                                fVar249 + 0.041665796) * fVar249 + 0.16666666) * fVar249;
          fVar246 = fVar246 + ((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 + 0.008333452) *
                                fVar250 + 0.041665796) * fVar250 + 0.16666666) * fVar250;
          auVar196 = ZEXT1664(CONCAT412(fVar246,CONCAT48(fVar243,CONCAT44(fVar202,fVar201))));
          auVar126._0_4_ = (int)auVar106._0_4_;
          auVar126._4_4_ = (int)auVar106._4_4_;
          auVar126._8_4_ = (int)auVar106._8_4_;
          auVar126._12_4_ = (int)auVar106._12_4_;
          auVar106 = vpslld_avx(auVar126,0x17);
          auVar106 = vpaddd_avx(auVar106,auVar211);
          auVar68._0_4_ = (fVar247 + 1.0 + fVar247 * fVar247 * fVar201) * auVar106._0_4_ + 1.0;
          auVar68._4_4_ = (fVar248 + 1.0 + fVar248 * fVar248 * fVar202) * auVar106._4_4_ + 1.0;
          auVar68._8_4_ = (fVar249 + 1.0 + fVar249 * fVar249 * fVar243) * auVar106._8_4_ + 1.0;
          auVar68._12_4_ = (fVar250 + 1.0 + fVar250 * fVar250 * fVar246) * auVar106._12_4_ + 1.0;
          auVar127._8_4_ = 0x40000000;
          auVar127._0_8_ = 0x4000000040000000;
          auVar127._12_4_ = 0x40000000;
          auVar106 = vdivps_avx(auVar127,auVar68);
          auVar69._0_4_ = auVar106._0_4_ + -1.0;
          auVar69._4_4_ = auVar106._4_4_ + -1.0;
          auVar69._8_4_ = auVar106._8_4_ + -1.0;
          auVar69._12_4_ = auVar106._12_4_ + -1.0;
          goto LAB_002d5787;
        case 6:
          pfVar29 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar201 = *pfVar29;
          fVar202 = pfVar29[1];
          auVar73._0_4_ = auVar244._0_4_ * fVar201 + fVar202;
          auVar73._4_4_ = auVar244._4_4_ * fVar201 + fVar202;
          auVar73._8_4_ = auVar244._8_4_ * fVar201 + fVar202;
          auVar73._12_4_ = auVar244._12_4_ * fVar201 + fVar202;
          auVar106 = vmaxps_avx(auVar73,auVar106);
          auVar127._8_4_ = 0x3f800000;
          auVar127._0_8_ = 0x3f8000003f800000;
          auVar127._12_4_ = 0x3f800000;
          auVar69 = vminps_avx(auVar106,auVar127);
LAB_002d5787:
          in_ZMM2 = ZEXT1664(auVar127);
          auVar74._0_4_ = auVar244._0_4_ * auVar69._0_4_;
          auVar74._4_4_ = auVar244._4_4_ * auVar69._4_4_;
          auVar74._8_4_ = auVar244._8_4_ * auVar69._8_4_;
          auVar74._12_4_ = auVar244._12_4_ * auVar69._12_4_;
        }
switchD_002d537a_caseD_1:
        *(undefined1 (*) [16])((long)top_blob->data + lVar1 * 4) = auVar74;
        lVar36 = lVar36 + lVar34;
        lVar31 = lVar31 + lVar34;
        local_120 = local_120 + lVar34;
        lVar35 = lVar35 + lVar34;
      }
      pfVar29 = (float *)(this->super_InnerProduct).activation_params.data;
      pvVar12 = (this->weight_data_tm).data;
      pvVar15 = top_blob->data;
      local_148 = 0;
      for (lVar31 = (long)(int)((int)uVar28 + uVar24 * 4); lVar31 < (int)uVar9; lVar31 = lVar31 + 1)
      {
        if (pvVar11 == (void *)0x0) {
          fVar201 = 0.0;
        }
        else {
          fVar201 = *(float *)((long)pvVar11 + lVar31 * 4);
        }
        pfVar26 = (float *)((long)pvVar12 + lVar31 * local_b8 * 4);
        fVar202 = 0.0;
        fVar243 = 0.0;
        fVar246 = 0.0;
        fVar247 = 0.0;
        fVar248 = 0.0;
        fVar249 = 0.0;
        fVar250 = 0.0;
        fVar251 = 0.0;
        pfVar30 = pfVar39;
        for (iVar37 = 0; iVar37 + 7 < iVar33; iVar37 = iVar37 + 8) {
          fVar246 = *pfVar26 * *pfVar30 + fVar246;
          fVar247 = pfVar26[1] * pfVar30[1] + fVar247;
          fVar202 = pfVar26[2] * pfVar30[2] + fVar202;
          fVar243 = pfVar26[3] * pfVar30[3] + fVar243;
          fVar248 = pfVar26[4] * pfVar30[4] + fVar248;
          fVar249 = pfVar26[5] * pfVar30[5] + fVar249;
          fVar250 = pfVar26[6] * pfVar30[6] + fVar250;
          fVar251 = pfVar26[7] + fVar251;
          pfVar30 = pfVar30 + 8;
          pfVar26 = pfVar26 + 8;
        }
        fVar252 = 0.0;
        fVar197 = 0.0;
        fVar200 = 0.0;
        fVar203 = 0.0;
        for (; iVar37 + 3 < iVar33; iVar37 = iVar37 + 4) {
          fVar252 = *pfVar26 * *pfVar30 + fVar252;
          fVar197 = pfVar26[1] * pfVar30[1] + fVar197;
          fVar200 = pfVar26[2] * pfVar30[2] + fVar200;
          fVar203 = pfVar26[3] * pfVar30[3] + fVar203;
          pfVar30 = pfVar30 + 4;
          pfVar26 = pfVar26 + 4;
        }
        lVar34 = 0;
        for (; iVar37 < iVar33; iVar37 = iVar37 + 1) {
          fVar201 = *(float *)((long)pfVar26 + lVar34) * *(float *)((long)pfVar30 + lVar34) +
                    fVar201;
          lVar34 = lVar34 + 4;
        }
        auVar75._0_4_ = fVar246 + fVar252 + fVar248;
        auVar75._4_4_ = fVar247 + fVar197 + fVar249;
        auVar75._8_4_ = fVar202 + fVar200 + fVar250;
        auVar75._12_4_ = fVar243 + fVar203 + fVar251;
        auVar106 = vhaddps_avx(auVar75,auVar75);
        auVar106 = vhaddps_avx(auVar106,auVar106);
        fVar201 = auVar106._0_4_ + fVar201;
        auVar106 = ZEXT416((uint)fVar201);
        fVar202 = fVar201;
        switch(iVar23) {
        case 1:
          auVar106 = vmaxss_avx(auVar106,ZEXT416(0));
          fVar202 = auVar106._0_4_;
          break;
        case 2:
          auVar106 = vcmpss_avx(ZEXT816(0) << 0x40,auVar106,1);
          auVar134._8_4_ = 0x3f800000;
          auVar134._0_8_ = 0x3f8000003f800000;
          auVar134._12_4_ = 0x3f800000;
          auVar106 = vblendvps_avx(ZEXT416((uint)*pfVar29),auVar134,auVar106);
          fVar202 = auVar106._0_4_;
LAB_002d5999:
          fVar202 = fVar202 * fVar201;
          break;
        case 3:
          auVar106 = vmaxss_avx(auVar106,ZEXT416((uint)*pfVar29));
          fVar202 = auVar106._0_4_;
          if (pfVar29[1] < auVar106._0_4_) {
            fVar202 = pfVar29[1];
          }
          break;
        case 4:
          auVar106 = vminss_avx(auVar106,ZEXT416(0x42b0c0a5));
          auVar76._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
          auVar76._8_4_ = auVar106._8_4_ ^ 0x80000000;
          auVar76._12_4_ = auVar106._12_4_ ^ 0x80000000;
          auVar106 = vcmpss_avx(auVar106,ZEXT416(0xc2b0c0a5),1);
          auVar133._8_4_ = 0x42b0c0a5;
          auVar133._0_8_ = 0x42b0c0a542b0c0a5;
          auVar133._12_4_ = 0x42b0c0a5;
          auVar106 = vblendvps_avx(auVar76,auVar133,auVar106);
          fVar201 = expf(auVar106._0_4_);
          fVar202 = 1.0 / (fVar201 + 1.0);
          break;
        case 5:
          fVar202 = expf(fVar201);
          fVar202 = logf(fVar202 + 1.0);
          fVar202 = tanhf(fVar202);
          fVar202 = fVar202 * fVar201;
          break;
        case 6:
          fVar243 = *pfVar29;
          fVar246 = -pfVar29[1] / fVar243;
          fVar202 = 0.0;
          if ((fVar246 <= fVar201) && (fVar202 = fVar201, fVar201 <= fVar246 + 1.0 / fVar243)) {
            fVar202 = fVar243 * fVar201 + pfVar29[1];
            goto LAB_002d5999;
          }
        }
        *(float *)((long)pvVar15 + lVar31 * 4) = fVar202;
      }
    }
    else if (iVar37 == 4) {
      local_148 = 0;
      uVar28 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar28 = 0;
      }
      auVar196 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar255 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      for (uVar27 = 0; uVar27 != uVar28; uVar27 = uVar27 + 1) {
        if (pvVar11 == (void *)0x0) {
          fVar201 = 0.0;
          fVar202 = 0.0;
          fVar243 = 0.0;
          fVar246 = 0.0;
        }
        else {
          pfVar39 = (float *)((long)pvVar11 + uVar27 * 0x10);
          fVar201 = *pfVar39;
          fVar202 = pfVar39[1];
          fVar243 = pfVar39[2];
          fVar246 = pfVar39[3];
        }
        pvVar12 = (this->weight_data_tm).data;
        sVar13 = (this->weight_data_tm).elemsize;
        lVar31 = (long)(this->weight_data_tm).w;
        pfVar29 = (float *)(uVar27 * lVar31 * sVar13 + (long)pvVar12);
        lVar34 = 0;
        fVar249 = 0.0;
        fVar250 = 0.0;
        fVar99 = 0.0;
        fVar150 = 0.0;
        fVar151 = 0.0;
        fVar175 = 0.0;
        fVar176 = 0.0;
        lVar36 = 0;
        fVar197 = 0.0;
        fVar200 = 0.0;
        fVar262 = 0.0;
        fVar59 = 0.0;
        fVar97 = 0.0;
        fVar100 = 0.0;
        fVar101 = 0.0;
        fVar251 = 0.0;
        fVar252 = 0.0;
        fVar216 = 0.0;
        fVar217 = 0.0;
        fVar228 = 0.0;
        fVar229 = 0.0;
        fVar261 = 0.0;
        fVar247 = 0.0;
        fVar248 = 0.0;
        fVar203 = 0.0;
        fVar204 = 0.0;
        fVar205 = 0.0;
        fVar206 = 0.0;
        fVar98 = 0.0;
        pfVar39 = local_108;
        for (iVar37 = 0; iVar37 + 7 < iVar33; iVar37 = iVar37 + 8) {
          fVar102 = *pfVar39;
          fVar103 = pfVar39[1];
          fVar104 = pfVar39[2];
          fVar149 = pfVar39[4];
          fVar152 = pfVar39[6];
          fVar203 = fVar102 * *pfVar29 + fVar203;
          fVar204 = fVar102 * pfVar29[1] + fVar204;
          fVar247 = fVar102 * pfVar29[2] + fVar247;
          fVar248 = fVar102 * pfVar29[3] + fVar248;
          fVar205 = fVar103 * pfVar29[4] + fVar205;
          fVar206 = fVar103 * pfVar29[6] + fVar206;
          fVar98 = fVar103 + fVar98;
          fVar216 = fVar216 + fVar104 * pfVar29[8];
          fVar217 = fVar217 + fVar104 * pfVar29[9];
          fVar251 = fVar251 + fVar104 * pfVar29[10];
          fVar252 = fVar252 + fVar104 * pfVar29[0xb];
          fVar228 = fVar228 + pfVar39[3] * pfVar29[0xc];
          fVar229 = fVar229 + pfVar39[3] * pfVar29[0xe];
          fVar261 = fVar261 + fVar103;
          fVar262 = fVar262 + fVar149 * pfVar29[0x10];
          fVar59 = fVar59 + fVar149 * pfVar29[0x11];
          fVar197 = fVar197 + fVar149 * pfVar29[0x12];
          fVar200 = fVar200 + fVar149 * pfVar29[0x13];
          fVar97 = fVar97 + pfVar39[5] * pfVar29[0x14];
          fVar100 = fVar100 + pfVar39[5] * pfVar29[0x16];
          fVar101 = fVar101 + fVar103;
          fVar99 = fVar152 * pfVar29[0x18] + fVar99;
          fVar150 = fVar152 * pfVar29[0x19] + fVar150;
          fVar249 = fVar152 * pfVar29[0x1a] + fVar249;
          fVar250 = fVar152 * pfVar29[0x1b] + fVar250;
          fVar151 = pfVar39[7] * pfVar29[0x1c] + fVar151;
          fVar175 = pfVar39[7] * pfVar29[0x1e] + fVar175;
          fVar176 = fVar103 + fVar176;
          pfVar39 = pfVar39 + 8;
          pfVar29 = pfVar29 + 0x20;
          lVar36 = lVar36 + 0x20;
          lVar34 = lVar34 + 8;
        }
        lVar31 = sVar13 * uVar27 * lVar31;
        for (; iVar37 + 3 < iVar33; iVar37 = iVar37 + 4) {
          fVar102 = *(float *)((long)local_108 + lVar36 + 4);
          fVar103 = *(float *)((long)local_108 + lVar36);
          fVar104 = *(float *)((long)local_108 + lVar36 + 0xc);
          fVar149 = *(float *)((long)local_108 + lVar36 + 8);
          pfVar39 = (float *)((long)pvVar12 + lVar36 * 4 + lVar31);
          fVar203 = fVar103 * *pfVar39 + fVar203;
          fVar204 = fVar103 * pfVar39[1] + fVar204;
          fVar247 = fVar103 * pfVar39[2] + fVar247;
          fVar248 = fVar103 * pfVar39[3] + fVar248;
          fVar205 = fVar102 * pfVar39[4] + fVar205;
          fVar206 = fVar102 * pfVar39[6] + fVar206;
          fVar98 = fVar102 + fVar98;
          pfVar39 = (float *)((long)pvVar12 + lVar36 * 4 + lVar31 + 0x20);
          fVar216 = fVar216 + fVar149 * *pfVar39;
          fVar217 = fVar217 + fVar149 * pfVar39[1];
          fVar251 = fVar251 + fVar149 * pfVar39[2];
          fVar252 = fVar252 + fVar149 * pfVar39[3];
          fVar228 = fVar228 + fVar104 * pfVar39[4];
          fVar229 = fVar229 + fVar104 * pfVar39[6];
          fVar261 = fVar261 + fVar102;
          pfVar29 = pfVar29 + 0x10;
          lVar36 = lVar36 + 0x10;
          lVar34 = lVar34 + 4;
        }
        for (; (int)lVar34 < iVar33; lVar34 = lVar34 + 1) {
          fVar102 = local_108[lVar34];
          fVar201 = fVar102 * *pfVar29 + fVar201;
          fVar202 = fVar102 * pfVar29[1] + fVar202;
          fVar243 = fVar102 * pfVar29[2] + fVar243;
          fVar246 = fVar102 * pfVar29[3] + fVar246;
          pfVar29 = pfVar29 + 4;
        }
        fVar204 = fVar59 + fVar150 + fVar217 + fVar204;
        auVar61._0_4_ =
             fVar97 + fVar151 + fVar228 + fVar205 + fVar262 + fVar99 + fVar216 + fVar203 + fVar201;
        auVar61._4_4_ = fVar204 + fVar204 + fVar202;
        auVar61._8_4_ =
             fVar100 + fVar175 + fVar229 + fVar206 + fVar197 + fVar249 + fVar251 + fVar247 + fVar243
        ;
        auVar61._12_4_ =
             fVar101 + fVar176 + fVar261 + fVar98 + fVar200 + fVar250 + fVar252 + fVar248 + fVar246;
        auVar118 = auVar61;
        if (5 < iVar23 - 1U) goto switchD_002d45c3_caseD_1;
        auVar106 = auVar196._0_16_;
        auVar118 = vmaxps_avx(auVar61,auVar106);
        fVar201 = auVar255._0_4_;
        fVar202 = auVar255._4_4_;
        fVar243 = auVar255._8_4_;
        fVar246 = auVar255._12_4_;
        switch(iVar23) {
        case 2:
          auVar106 = vminps_avx(auVar61,auVar106);
          fVar201 = *(this->super_InnerProduct).activation_params.data;
          auVar108._0_4_ = fVar201 * auVar106._0_4_ + auVar118._0_4_;
          auVar108._4_4_ = fVar201 * auVar106._4_4_ + auVar118._4_4_;
          auVar108._8_4_ = fVar201 * auVar106._8_4_ + auVar118._8_4_;
          auVar108._12_4_ = fVar201 * auVar106._12_4_ + auVar118._12_4_;
          auVar118 = auVar108;
          break;
        case 3:
          puVar14 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar8 = *puVar14;
          auVar112._4_4_ = uVar8;
          auVar112._0_4_ = uVar8;
          auVar112._8_4_ = uVar8;
          auVar112._12_4_ = uVar8;
          uVar8 = puVar14[1];
          auVar168._4_4_ = uVar8;
          auVar168._0_4_ = uVar8;
          auVar168._8_4_ = uVar8;
          auVar168._12_4_ = uVar8;
          auVar106 = vmaxps_avx(auVar61,auVar112);
          auVar118 = vminps_avx(auVar106,auVar168);
          break;
        case 4:
          uVar22 = CONCAT44(auVar61._4_4_,auVar61._0_4_);
          auVar62._0_8_ = uVar22 ^ 0x8000000080000000;
          auVar62._8_4_ = -auVar61._8_4_;
          auVar62._12_4_ = -auVar61._12_4_;
          auVar113._8_4_ = 0x42b0c0a5;
          auVar113._0_8_ = 0x42b0c0a542b0c0a5;
          auVar113._12_4_ = 0x42b0c0a5;
          auVar106 = vminps_avx(auVar62,auVar113);
          auVar114._8_4_ = 0xc2b0c0a5;
          auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar114._12_4_ = 0xc2b0c0a5;
          auVar224 = vmaxps_avx(auVar106,auVar114);
          auVar115._0_4_ = fVar201 + auVar224._0_4_ * 1.442695;
          auVar115._4_4_ = fVar202 + auVar224._4_4_ * 1.442695;
          auVar115._8_4_ = fVar243 + auVar224._8_4_ * 1.442695;
          auVar115._12_4_ = fVar246 + auVar224._12_4_ * 1.442695;
          auVar169._0_4_ = (int)auVar115._0_4_;
          auVar169._4_4_ = (int)auVar115._4_4_;
          auVar169._8_4_ = (int)auVar115._8_4_;
          auVar169._12_4_ = (int)auVar115._12_4_;
          auVar157 = vcvtdq2ps_avx(auVar169);
          auVar106 = vcmpps_avx(auVar115,auVar157,1);
          auVar106 = vandps_avx(auVar106,auVar41);
          auVar106 = vsubps_avx(auVar157,auVar106);
          fVar247 = auVar224._0_4_ + auVar106._0_4_ * -0.6931472;
          fVar248 = auVar224._4_4_ + auVar106._4_4_ * -0.6931472;
          fVar249 = auVar224._8_4_ + auVar106._8_4_ * -0.6931472;
          fVar250 = auVar224._12_4_ + auVar106._12_4_ * -0.6931472;
          auVar116._0_4_ = (int)auVar106._0_4_;
          auVar116._4_4_ = (int)auVar106._4_4_;
          auVar116._8_4_ = (int)auVar106._8_4_;
          auVar116._12_4_ = (int)auVar106._12_4_;
          auVar106 = vpslld_avx(auVar116,0x17);
          auVar106 = vpaddd_avx(auVar106,auVar41);
          auVar63._0_4_ =
               (fVar247 + 1.0 +
               fVar247 * fVar247 *
               (fVar201 +
               ((((fVar247 * 0.00019875691 + 0.0013981999) * fVar247 + 0.008333452) * fVar247 +
                0.041665796) * fVar247 + 0.16666666) * fVar247)) * auVar106._0_4_ + 1.0;
          auVar63._4_4_ =
               (fVar248 + 1.0 +
               fVar248 * fVar248 *
               (fVar202 +
               ((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) * fVar248 +
                0.041665796) * fVar248 + 0.16666666) * fVar248)) * auVar106._4_4_ + 1.0;
          auVar63._8_4_ =
               (fVar249 + 1.0 +
               fVar249 * fVar249 *
               (fVar243 +
               ((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) * fVar249 +
                0.041665796) * fVar249 + 0.16666666) * fVar249)) * auVar106._8_4_ + 1.0;
          auVar63._12_4_ =
               (fVar250 + 1.0 +
               fVar250 * fVar250 *
               (fVar246 +
               ((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 + 0.008333452) * fVar250 +
                0.041665796) * fVar250 + 0.16666666) * fVar250)) * auVar106._12_4_ + 1.0;
          auVar118 = vdivps_avx(auVar41,auVar63);
          break;
        case 5:
          auVar235._8_4_ = 0x42b0c0a5;
          auVar235._0_8_ = 0x42b0c0a542b0c0a5;
          auVar235._12_4_ = 0x42b0c0a5;
          auVar106 = vminps_avx(auVar235,auVar61);
          auVar238._8_4_ = 0xc2b0c0a5;
          auVar238._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar238._12_4_ = 0xc2b0c0a5;
          auVar224 = vmaxps_avx(auVar238,auVar106);
          auVar159._0_4_ = fVar201 + auVar224._0_4_ * 1.442695;
          auVar159._4_4_ = fVar202 + auVar224._4_4_ * 1.442695;
          auVar159._8_4_ = fVar243 + auVar224._8_4_ * 1.442695;
          auVar159._12_4_ = fVar246 + auVar224._12_4_ * 1.442695;
          auVar181._0_4_ = (int)auVar159._0_4_;
          auVar181._4_4_ = (int)auVar159._4_4_;
          auVar181._8_4_ = (int)auVar159._8_4_;
          auVar181._12_4_ = (int)auVar159._12_4_;
          auVar157 = vcvtdq2ps_avx(auVar181);
          auVar106 = vcmpps_avx(auVar159,auVar157,1);
          auVar106 = vandps_avx(auVar106,auVar41);
          auVar106 = vsubps_avx(auVar157,auVar106);
          auVar182._0_4_ = auVar106._0_4_ * 0.6931472;
          auVar182._4_4_ = auVar106._4_4_ * 0.6931472;
          auVar182._8_4_ = auVar106._8_4_ * 0.6931472;
          auVar182._12_4_ = auVar106._12_4_ * 0.6931472;
          auVar157 = vsubps_avx(auVar224,auVar182);
          fVar247 = auVar157._0_4_;
          fVar248 = auVar157._4_4_;
          fVar249 = auVar157._8_4_;
          fVar250 = auVar157._12_4_;
          auVar160._0_4_ = (int)auVar106._0_4_;
          auVar160._4_4_ = (int)auVar106._4_4_;
          auVar160._8_4_ = (int)auVar106._8_4_;
          auVar160._12_4_ = (int)auVar106._12_4_;
          auVar106 = vpslld_avx(auVar160,0x17);
          auVar106 = vpaddd_avx(auVar106,auVar41);
          auVar109._0_4_ =
               (fVar247 + 1.0 +
               fVar247 * fVar247 *
               (((((fVar247 * 0.00019875691 + 0.0013981999) * fVar247 + 0.008333452) * fVar247 +
                 0.041665796) * fVar247 + 0.16666666) * fVar247 + fVar201)) * auVar106._0_4_ + 1.0;
          auVar109._4_4_ =
               (fVar248 + 1.0 +
               fVar248 * fVar248 *
               (((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) * fVar248 +
                 0.041665796) * fVar248 + 0.16666666) * fVar248 + fVar202)) * auVar106._4_4_ + 1.0;
          auVar109._8_4_ =
               (fVar249 + 1.0 +
               fVar249 * fVar249 *
               (((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) * fVar249 +
                 0.041665796) * fVar249 + 0.16666666) * fVar249 + fVar243)) * auVar106._8_4_ + 1.0;
          auVar109._12_4_ =
               (fVar250 + 1.0 +
               fVar250 * fVar250 *
               (((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 + 0.008333452) * fVar250 +
                 0.041665796) * fVar250 + 0.16666666) * fVar250 + fVar246)) * auVar106._12_4_ + 1.0;
          auVar161._8_4_ = 0x800000;
          auVar161._0_8_ = 0x80000000800000;
          auVar161._12_4_ = 0x800000;
          auVar106 = vmaxps_avx(auVar109,auVar161);
          auVar157 = vpsrld_avx(auVar106,0x17);
          auVar208._8_4_ = 0xffffff82;
          auVar208._0_8_ = 0xffffff82ffffff82;
          auVar208._12_4_ = 0xffffff82;
          auVar157 = vpaddd_avx(auVar157,auVar208);
          auVar209._8_4_ = 0x807fffff;
          auVar209._0_8_ = 0x807fffff807fffff;
          auVar209._12_4_ = 0x807fffff;
          auVar106 = vandps_avx(auVar106,auVar209);
          auVar236 = vorps_avx(auVar106,auVar255._0_16_);
          auVar224 = vcvtdq2ps_avx(auVar157);
          auVar210._8_4_ = 0x3f3504f3;
          auVar210._0_8_ = 0x3f3504f33f3504f3;
          auVar210._12_4_ = 0x3f3504f3;
          auVar157 = vcmpps_avx(auVar236,auVar210,1);
          auVar106 = vandps_avx(auVar157,auVar236);
          fVar247 = auVar106._0_4_ + auVar236._0_4_ + -1.0;
          fVar248 = auVar106._4_4_ + auVar236._4_4_ + -1.0;
          fVar249 = auVar106._8_4_ + auVar236._8_4_ + -1.0;
          fVar250 = auVar106._12_4_ + auVar236._12_4_ + -1.0;
          auVar106 = vandps_avx(auVar157,auVar41);
          auVar157 = vsubps_avx(auVar224,auVar106);
          auVar106 = vcmpps_avx(auVar109,_DAT_005370d0,2);
          auVar162._0_4_ =
               (auVar157._0_4_ * 0.6931472 + fVar247 +
               (((((((((fVar247 * 0.070376836 + -0.1151461) * fVar247 + 0.116769984) * fVar247 +
                     -0.12420141) * fVar247 + 0.14249323) * fVar247 + -0.16668057) * fVar247 +
                  0.20000714) * fVar247 + -0.24999994) * fVar247 + 0.3333333) * fVar247 + -0.5) *
               fVar247 * fVar247) * -2.0;
          auVar162._4_4_ =
               (auVar157._4_4_ * 0.6931472 + fVar248 +
               (((((((((fVar248 * 0.070376836 + -0.1151461) * fVar248 + 0.116769984) * fVar248 +
                     -0.12420141) * fVar248 + 0.14249323) * fVar248 + -0.16668057) * fVar248 +
                  0.20000714) * fVar248 + -0.24999994) * fVar248 + 0.3333333) * fVar248 + -0.5) *
               fVar248 * fVar248) * -2.0;
          auVar162._8_4_ =
               (auVar157._8_4_ * 0.6931472 + fVar249 +
               (((((((((fVar249 * 0.070376836 + -0.1151461) * fVar249 + 0.116769984) * fVar249 +
                     -0.12420141) * fVar249 + 0.14249323) * fVar249 + -0.16668057) * fVar249 +
                  0.20000714) * fVar249 + -0.24999994) * fVar249 + 0.3333333) * fVar249 + -0.5) *
               fVar249 * fVar249) * -2.0;
          auVar162._12_4_ =
               (auVar157._12_4_ * 0.6931472 + fVar250 +
               (((((((((fVar250 * 0.070376836 + -0.1151461) * fVar250 + 0.116769984) * fVar250 +
                     -0.12420141) * fVar250 + 0.14249323) * fVar250 + -0.16668057) * fVar250 +
                  0.20000714) * fVar250 + -0.24999994) * fVar250 + 0.3333333) * fVar250 + -0.5) *
               fVar250 * fVar250) * -2.0;
          auVar183._8_4_ = 0x7fffffff;
          auVar183._0_8_ = 0x7fffffff7fffffff;
          auVar183._12_4_ = 0x7fffffff;
          auVar106 = vblendvps_avx(auVar162,auVar183,auVar106);
          auVar163._8_4_ = 0x42b0c0a5;
          auVar163._0_8_ = 0x42b0c0a542b0c0a5;
          auVar163._12_4_ = 0x42b0c0a5;
          auVar106 = vminps_avx(auVar106,auVar163);
          auVar164._8_4_ = 0xc2b0c0a5;
          auVar164._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar164._12_4_ = 0xc2b0c0a5;
          auVar224 = vmaxps_avx(auVar106,auVar164);
          auVar165._0_4_ = auVar224._0_4_ * 1.442695 + fVar201;
          auVar165._4_4_ = auVar224._4_4_ * 1.442695 + fVar202;
          auVar165._8_4_ = auVar224._8_4_ * 1.442695 + fVar243;
          auVar165._12_4_ = auVar224._12_4_ * 1.442695 + fVar246;
          auVar184._0_4_ = (int)auVar165._0_4_;
          auVar184._4_4_ = (int)auVar165._4_4_;
          auVar184._8_4_ = (int)auVar165._8_4_;
          auVar184._12_4_ = (int)auVar165._12_4_;
          auVar157 = vcvtdq2ps_avx(auVar184);
          auVar106 = vcmpps_avx(auVar165,auVar157,1);
          auVar106 = vandps_avx(auVar106,auVar41);
          auVar106 = vsubps_avx(auVar157,auVar106);
          auVar185._0_4_ = auVar106._0_4_ * 0.6931472;
          auVar185._4_4_ = auVar106._4_4_ * 0.6931472;
          auVar185._8_4_ = auVar106._8_4_ * 0.6931472;
          auVar185._12_4_ = auVar106._12_4_ * 0.6931472;
          auVar157 = vsubps_avx(auVar224,auVar185);
          fVar247 = auVar157._0_4_;
          fVar248 = auVar157._4_4_;
          fVar249 = auVar157._8_4_;
          fVar250 = auVar157._12_4_;
          auVar255 = ZEXT1664(auVar255._0_16_);
          auVar196 = ZEXT864(0) << 0x20;
          auVar166._0_4_ = (int)auVar106._0_4_;
          auVar166._4_4_ = (int)auVar106._4_4_;
          auVar166._8_4_ = (int)auVar106._8_4_;
          auVar166._12_4_ = (int)auVar106._12_4_;
          auVar106 = vpslld_avx(auVar166,0x17);
          auVar106 = vpaddd_avx(auVar106,auVar41);
          auVar110._0_4_ =
               (fVar247 + 1.0 +
               fVar247 * fVar247 *
               (fVar201 +
               ((((fVar247 * 0.00019875691 + 0.0013981999) * fVar247 + 0.008333452) * fVar247 +
                0.041665796) * fVar247 + 0.16666666) * fVar247)) * auVar106._0_4_ + 1.0;
          auVar110._4_4_ =
               (fVar248 + 1.0 +
               fVar248 * fVar248 *
               (fVar202 +
               ((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) * fVar248 +
                0.041665796) * fVar248 + 0.16666666) * fVar248)) * auVar106._4_4_ + 1.0;
          auVar110._8_4_ =
               (fVar249 + 1.0 +
               fVar249 * fVar249 *
               (fVar243 +
               ((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) * fVar249 +
                0.041665796) * fVar249 + 0.16666666) * fVar249)) * auVar106._8_4_ + 1.0;
          auVar110._12_4_ =
               (fVar250 + 1.0 +
               fVar250 * fVar250 *
               (fVar246 +
               ((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 + 0.008333452) * fVar250 +
                0.041665796) * fVar250 + 0.16666666) * fVar250)) * auVar106._12_4_ + 1.0;
          auVar167._8_4_ = 0x40000000;
          auVar167._0_8_ = 0x4000000040000000;
          auVar167._12_4_ = 0x40000000;
          auVar106 = vdivps_avx(auVar167,auVar110);
          auVar111._0_4_ = auVar106._0_4_ + -1.0;
          auVar111._4_4_ = auVar106._4_4_ + -1.0;
          auVar111._8_4_ = auVar106._8_4_ + -1.0;
          auVar111._12_4_ = auVar106._12_4_ + -1.0;
          goto LAB_002d49b4;
        case 6:
          pfVar39 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar201 = *pfVar39;
          fVar202 = pfVar39[1];
          auVar117._0_4_ = fVar201 * auVar61._0_4_ + fVar202;
          auVar117._4_4_ = fVar201 * auVar61._4_4_ + fVar202;
          auVar117._8_4_ = fVar201 * auVar61._8_4_ + fVar202;
          auVar117._12_4_ = fVar201 * auVar61._12_4_ + fVar202;
          auVar106 = vmaxps_avx(auVar117,auVar106);
          auVar111 = vminps_avx(auVar106,auVar41);
LAB_002d49b4:
          auVar118._0_4_ = auVar111._0_4_ * auVar61._0_4_;
          auVar118._4_4_ = auVar111._4_4_ * auVar61._4_4_;
          auVar118._8_4_ = auVar111._8_4_ * auVar61._8_4_;
          auVar118._12_4_ = auVar111._12_4_ * auVar61._12_4_;
        }
switchD_002d45c3_caseD_1:
        *(undefined1 (*) [16])((long)top_blob->data + uVar27 * 0x10) = auVar118;
      }
    }
    else {
      local_148 = 0;
      if (iVar37 == 8) {
        local_148 = 0;
        uVar28 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar28 = 0;
        }
        auVar196 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar255 = ZEXT864(0);
        for (uVar27 = 0; uVar27 != uVar28; uVar27 = uVar27 + 1) {
          fVar201 = 0.0;
          fVar202 = 0.0;
          fVar197 = 0.0;
          fVar200 = 0.0;
          fVar203 = 0.0;
          fVar204 = 0.0;
          fVar205 = 0.0;
          fVar206 = 0.0;
          fVar247 = 0.0;
          fVar248 = 0.0;
          fVar243 = 0.0;
          fVar246 = 0.0;
          fVar249 = 0.0;
          fVar250 = 0.0;
          fVar251 = 0.0;
          fVar252 = 0.0;
          if (pvVar11 != (void *)0x0) {
            pfVar39 = (float *)((long)pvVar11 + uVar27 * 0x20);
            fVar243 = *pfVar39;
            fVar246 = pfVar39[1];
            fVar247 = pfVar39[2];
            fVar248 = pfVar39[3];
            fVar249 = pfVar39[4];
            fVar250 = pfVar39[5];
            fVar251 = pfVar39[6];
            fVar252 = pfVar39[7];
          }
          pvVar12 = (this->weight_data_tm).data;
          sVar13 = (this->weight_data_tm).elemsize;
          lVar31 = (long)(this->weight_data_tm).w;
          pfVar29 = (float *)(uVar27 * lVar31 * sVar13 + (long)pvVar12);
          lVar34 = 0;
          lVar36 = 0;
          fVar261 = 0.0;
          fVar262 = 0.0;
          fVar257 = 0.0;
          fVar260 = 0.0;
          fVar263 = 0.0;
          fVar264 = 0.0;
          fVar265 = 0.0;
          fVar266 = 0.0;
          fVar98 = 0.0;
          fVar99 = 0.0;
          fVar59 = 0.0;
          fVar97 = 0.0;
          fVar100 = 0.0;
          fVar101 = 0.0;
          fVar102 = 0.0;
          fVar103 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar156 = 0.0;
          fVar174 = 0.0;
          fVar177 = 0.0;
          fVar178 = 0.0;
          fVar179 = 0.0;
          fVar180 = 0.0;
          fVar150 = 0.0;
          fVar151 = 0.0;
          fVar104 = 0.0;
          fVar149 = 0.0;
          fVar152 = 0.0;
          fVar153 = 0.0;
          fVar154 = 0.0;
          fVar155 = 0.0;
          fVar216 = 0.0;
          fVar217 = 0.0;
          fVar207 = 0.0;
          fVar215 = 0.0;
          fVar218 = 0.0;
          fVar219 = 0.0;
          fVar220 = 0.0;
          fVar221 = 0.0;
          fVar228 = 0.0;
          fVar229 = 0.0;
          fVar222 = 0.0;
          fVar227 = 0.0;
          fVar230 = 0.0;
          fVar231 = 0.0;
          fVar232 = 0.0;
          fVar233 = 0.0;
          pfVar39 = local_108;
          for (iVar37 = 0; iVar37 + 7 < iVar33; iVar37 = iVar37 + 8) {
            fVar2 = *pfVar39;
            fVar3 = pfVar39[1];
            fVar4 = pfVar39[2];
            fVar5 = pfVar39[3];
            fVar243 = fVar2 * *pfVar29 + fVar243;
            fVar246 = fVar2 * pfVar29[1] + fVar246;
            fVar247 = fVar2 * pfVar29[2] + fVar247;
            fVar248 = fVar2 * pfVar29[3] + fVar248;
            fVar249 = fVar2 * pfVar29[4] + fVar249;
            fVar250 = fVar2 * pfVar29[5] + fVar250;
            fVar251 = fVar2 * pfVar29[6] + fVar251;
            fVar252 = fVar2 + fVar252;
            fVar222 = fVar3 * pfVar29[8] + fVar222;
            fVar227 = fVar3 * pfVar29[9] + fVar227;
            fVar228 = fVar3 * pfVar29[10] + fVar228;
            fVar229 = fVar3 * pfVar29[0xb] + fVar229;
            fVar230 = fVar3 * pfVar29[0xc] + fVar230;
            fVar231 = fVar3 * pfVar29[0xd] + fVar231;
            fVar232 = fVar3 * pfVar29[0xe] + fVar232;
            fVar233 = fVar2 + fVar233;
            fVar207 = fVar4 * pfVar29[0x10] + fVar207;
            fVar215 = fVar4 * pfVar29[0x11] + fVar215;
            fVar216 = fVar4 * pfVar29[0x12] + fVar216;
            fVar217 = fVar4 * pfVar29[0x13] + fVar217;
            fVar218 = fVar4 * pfVar29[0x14] + fVar218;
            fVar219 = fVar4 * pfVar29[0x15] + fVar219;
            fVar220 = fVar4 * pfVar29[0x16] + fVar220;
            fVar221 = fVar2 + fVar221;
            fVar3 = pfVar39[4];
            fVar4 = pfVar39[5];
            fVar6 = pfVar39[6];
            fVar7 = pfVar39[7];
            fVar104 = fVar5 * pfVar29[0x18] + fVar104;
            fVar149 = fVar5 * pfVar29[0x19] + fVar149;
            fVar150 = fVar5 * pfVar29[0x1a] + fVar150;
            fVar151 = fVar5 * pfVar29[0x1b] + fVar151;
            fVar152 = fVar5 * pfVar29[0x1c] + fVar152;
            fVar153 = fVar5 * pfVar29[0x1d] + fVar153;
            fVar154 = fVar5 * pfVar29[0x1e] + fVar154;
            fVar155 = fVar2 + fVar155;
            fVar156 = fVar3 * pfVar29[0x20] + fVar156;
            fVar174 = fVar3 * pfVar29[0x21] + fVar174;
            fVar175 = fVar3 * pfVar29[0x22] + fVar175;
            fVar176 = fVar3 * pfVar29[0x23] + fVar176;
            fVar177 = fVar3 * pfVar29[0x24] + fVar177;
            fVar178 = fVar3 * pfVar29[0x25] + fVar178;
            fVar179 = fVar3 * pfVar29[0x26] + fVar179;
            fVar180 = fVar3 + fVar180;
            fVar59 = fVar4 * pfVar29[0x28] + fVar59;
            fVar97 = fVar4 * pfVar29[0x29] + fVar97;
            fVar98 = fVar4 * pfVar29[0x2a] + fVar98;
            fVar99 = fVar4 * pfVar29[0x2b] + fVar99;
            fVar100 = fVar4 * pfVar29[0x2c] + fVar100;
            fVar101 = fVar4 * pfVar29[0x2d] + fVar101;
            fVar102 = fVar4 * pfVar29[0x2e] + fVar102;
            fVar103 = fVar2 + fVar103;
            fVar257 = fVar6 * pfVar29[0x30] + fVar257;
            fVar260 = fVar6 * pfVar29[0x31] + fVar260;
            fVar261 = fVar6 * pfVar29[0x32] + fVar261;
            fVar262 = fVar6 * pfVar29[0x33] + fVar262;
            fVar263 = fVar6 * pfVar29[0x34] + fVar263;
            fVar264 = fVar6 * pfVar29[0x35] + fVar264;
            fVar265 = fVar6 * pfVar29[0x36] + fVar265;
            fVar266 = fVar2 + fVar266;
            fVar197 = fVar7 * pfVar29[0x38] + fVar197;
            fVar200 = fVar7 * pfVar29[0x39] + fVar200;
            fVar201 = fVar7 * pfVar29[0x3a] + fVar201;
            fVar202 = fVar7 * pfVar29[0x3b] + fVar202;
            fVar203 = fVar7 * pfVar29[0x3c] + fVar203;
            fVar204 = fVar7 * pfVar29[0x3d] + fVar204;
            fVar205 = fVar7 * pfVar29[0x3e] + fVar205;
            fVar206 = fVar7 + fVar206;
            pfVar39 = pfVar39 + 8;
            pfVar29 = pfVar29 + 0x40;
            lVar36 = lVar36 + 0x20;
            lVar34 = lVar34 + 8;
          }
          lVar31 = sVar13 * uVar27 * lVar31;
          for (; iVar37 + 3 < iVar33; iVar37 = iVar37 + 4) {
            fVar2 = *(float *)((long)local_108 + lVar36);
            fVar3 = *(float *)((long)local_108 + lVar36 + 4);
            fVar4 = *(float *)((long)local_108 + lVar36 + 8);
            fVar5 = *(float *)((long)local_108 + lVar36 + 0xc);
            pfVar39 = (float *)((long)pvVar12 + lVar36 * 8 + lVar31);
            pfVar26 = (float *)((long)pvVar12 + lVar36 * 8 + lVar31 + 0x20);
            fVar243 = fVar243 + fVar2 * *pfVar39;
            fVar246 = fVar246 + fVar2 * pfVar39[1];
            fVar247 = fVar247 + fVar2 * pfVar39[2];
            fVar248 = fVar248 + fVar2 * pfVar39[3];
            fVar249 = fVar249 + fVar2 * pfVar39[4];
            fVar250 = fVar250 + fVar2 * pfVar39[5];
            fVar251 = fVar251 + fVar2 * pfVar39[6];
            fVar252 = fVar252 + fVar2;
            fVar222 = fVar3 * *pfVar26 + fVar222;
            fVar227 = fVar3 * pfVar26[1] + fVar227;
            fVar228 = fVar3 * pfVar26[2] + fVar228;
            fVar229 = fVar3 * pfVar26[3] + fVar229;
            fVar230 = fVar3 * pfVar26[4] + fVar230;
            fVar231 = fVar3 * pfVar26[5] + fVar231;
            fVar232 = fVar3 * pfVar26[6] + fVar232;
            fVar233 = fVar3 + fVar233;
            pfVar39 = (float *)((long)pvVar12 + lVar36 * 8 + lVar31 + 0x40);
            fVar207 = fVar4 * *pfVar39 + fVar207;
            fVar215 = fVar4 * pfVar39[1] + fVar215;
            fVar216 = fVar4 * pfVar39[2] + fVar216;
            fVar217 = fVar4 * pfVar39[3] + fVar217;
            fVar218 = fVar4 * pfVar39[4] + fVar218;
            fVar219 = fVar4 * pfVar39[5] + fVar219;
            fVar220 = fVar4 * pfVar39[6] + fVar220;
            fVar221 = fVar2 + fVar221;
            pfVar39 = (float *)((long)pvVar12 + lVar36 * 8 + lVar31 + 0x60);
            fVar104 = fVar5 * *pfVar39 + fVar104;
            fVar149 = fVar5 * pfVar39[1] + fVar149;
            fVar150 = fVar5 * pfVar39[2] + fVar150;
            fVar151 = fVar5 * pfVar39[3] + fVar151;
            fVar152 = fVar5 * pfVar39[4] + fVar152;
            fVar153 = fVar5 * pfVar39[5] + fVar153;
            fVar154 = fVar5 * pfVar39[6] + fVar154;
            fVar155 = fVar2 + fVar155;
            pfVar29 = pfVar29 + 0x20;
            lVar36 = lVar36 + 0x10;
            lVar34 = lVar34 + 4;
          }
          for (; (int)lVar34 < iVar33; lVar34 = lVar34 + 1) {
            fVar2 = local_108[lVar34];
            fVar243 = fVar243 + fVar2 * *pfVar29;
            fVar246 = fVar246 + fVar2 * pfVar29[1];
            fVar247 = fVar247 + fVar2 * pfVar29[2];
            fVar248 = fVar248 + fVar2 * pfVar29[3];
            fVar249 = fVar249 + fVar2 * pfVar29[4];
            fVar250 = fVar250 + fVar2 * pfVar29[5];
            fVar251 = fVar251 + fVar2 * pfVar29[6];
            fVar252 = fVar252 + fVar2;
            pfVar29 = pfVar29 + 8;
          }
          fVar243 = fVar243 + fVar257 + fVar197 + fVar59 + fVar156 + fVar222 + fVar104 + fVar207;
          fVar246 = fVar246 + fVar260 + fVar200 + fVar97 + fVar174 + fVar227 + fVar149 + fVar215;
          auVar77._0_8_ = CONCAT44(fVar246,fVar243);
          auVar77._8_4_ =
               fVar247 + fVar261 + fVar201 + fVar98 + fVar175 + fVar228 + fVar150 + fVar216;
          auVar77._12_4_ =
               fVar248 + fVar262 + fVar202 + fVar99 + fVar176 + fVar229 + fVar151 + fVar217;
          auVar77._16_4_ =
               fVar249 + fVar263 + fVar203 + fVar100 + fVar177 + fVar230 + fVar152 + fVar218;
          auVar77._20_4_ =
               fVar250 + fVar264 + fVar204 + fVar101 + fVar178 + fVar231 + fVar153 + fVar219;
          auVar77._24_4_ =
               fVar251 + fVar265 + fVar205 + fVar102 + fVar179 + fVar232 + fVar154 + fVar220;
          auVar77._28_4_ =
               fVar252 + fVar266 + fVar206 + fVar103 + fVar180 + fVar233 + fVar155 + fVar221;
          auVar145 = auVar77;
          if (5 < iVar23 - 1U) goto switchD_002d3f31_caseD_1;
          auVar253 = auVar255._0_32_;
          auVar145 = vmaxps_avx(auVar253,auVar77);
          auVar53 = auVar196._0_32_;
          fVar201 = auVar196._0_4_;
          fVar202 = auVar196._4_4_;
          fVar247 = auVar196._8_4_;
          fVar248 = auVar196._12_4_;
          fVar249 = auVar196._16_4_;
          fVar250 = auVar196._20_4_;
          fVar251 = auVar196._24_4_;
          fVar252 = auVar196._28_4_;
          switch(iVar23) {
          case 2:
            auVar53 = vminps_avx(auVar253,auVar77);
            fVar201 = *(this->super_InnerProduct).activation_params.data;
            auVar135._0_4_ = fVar201 * auVar53._0_4_ + auVar145._0_4_;
            auVar135._4_4_ = fVar201 * auVar53._4_4_ + auVar145._4_4_;
            auVar135._8_4_ = fVar201 * auVar53._8_4_ + auVar145._8_4_;
            auVar135._12_4_ = fVar201 * auVar53._12_4_ + auVar145._12_4_;
            auVar135._16_4_ = fVar201 * auVar53._16_4_ + auVar145._16_4_;
            auVar135._20_4_ = fVar201 * auVar53._20_4_ + auVar145._20_4_;
            auVar135._24_4_ = fVar201 * auVar53._24_4_ + auVar145._24_4_;
            auVar135._28_4_ = auVar53._28_4_ + auVar145._28_4_;
            auVar145 = auVar135;
            break;
          case 3:
            puVar14 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar8 = *puVar14;
            auVar46._4_4_ = uVar8;
            auVar46._0_4_ = uVar8;
            auVar46._8_4_ = uVar8;
            auVar46._12_4_ = uVar8;
            auVar46._16_4_ = uVar8;
            auVar46._20_4_ = uVar8;
            auVar46._24_4_ = uVar8;
            auVar46._28_4_ = uVar8;
            uVar8 = puVar14[1];
            auVar144._4_4_ = uVar8;
            auVar144._0_4_ = uVar8;
            auVar144._8_4_ = uVar8;
            auVar144._12_4_ = uVar8;
            auVar144._16_4_ = uVar8;
            auVar144._20_4_ = uVar8;
            auVar144._24_4_ = uVar8;
            auVar144._28_4_ = uVar8;
            auVar53 = vmaxps_avx(auVar77,auVar46);
            auVar145 = vminps_avx(auVar53,auVar144);
            break;
          case 4:
            auVar47._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
            auVar47._8_4_ = -auVar77._8_4_;
            auVar47._12_4_ = -auVar77._12_4_;
            auVar47._16_4_ = -auVar77._16_4_;
            auVar47._20_4_ = -auVar77._20_4_;
            auVar47._24_4_ = -auVar77._24_4_;
            auVar47._28_4_ = -auVar77._28_4_;
            auVar78._8_4_ = 0x42b0c0a5;
            auVar78._0_8_ = 0x42b0c0a542b0c0a5;
            auVar78._12_4_ = 0x42b0c0a5;
            auVar78._16_4_ = 0x42b0c0a5;
            auVar78._20_4_ = 0x42b0c0a5;
            auVar78._24_4_ = 0x42b0c0a5;
            auVar78._28_4_ = 0x42b0c0a5;
            auVar253 = vminps_avx(auVar47,auVar78);
            auVar79._8_4_ = 0xc2b0c0a5;
            auVar79._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar79._12_4_ = 0xc2b0c0a5;
            auVar79._16_4_ = 0xc2b0c0a5;
            auVar79._20_4_ = 0xc2b0c0a5;
            auVar79._24_4_ = 0xc2b0c0a5;
            auVar79._28_4_ = 0xc2b0c0a5;
            auVar199 = vmaxps_avx(auVar253,auVar79);
            auVar80._0_4_ = auVar199._0_4_ * 1.442695 + 0.5;
            auVar80._4_4_ = auVar199._4_4_ * 1.442695 + 0.5;
            auVar80._8_4_ = auVar199._8_4_ * 1.442695 + 0.5;
            auVar80._12_4_ = auVar199._12_4_ * 1.442695 + 0.5;
            auVar80._16_4_ = auVar199._16_4_ * 1.442695 + 0.5;
            auVar80._20_4_ = auVar199._20_4_ * 1.442695 + 0.5;
            auVar80._24_4_ = auVar199._24_4_ * 1.442695 + 0.5;
            auVar80._28_4_ = 0x3ff8aa3b;
            auVar52 = vroundps_avx(auVar80,1);
            auVar253 = vcmpps_avx(auVar80,auVar52,1);
            auVar253 = vandps_avx(auVar253,auVar53);
            auVar253 = vsubps_avx(auVar52,auVar253);
            fVar243 = auVar199._0_4_ + auVar253._0_4_ * -0.6931472;
            fVar246 = auVar199._4_4_ + auVar253._4_4_ * -0.6931472;
            fVar197 = auVar199._8_4_ + auVar253._8_4_ * -0.6931472;
            fVar200 = auVar199._12_4_ + auVar253._12_4_ * -0.6931472;
            fVar203 = auVar199._16_4_ + auVar253._16_4_ * -0.6931472;
            fVar204 = auVar199._20_4_ + auVar253._20_4_ * -0.6931472;
            fVar205 = auVar199._24_4_ + auVar253._24_4_ * -0.6931472;
            auVar60._0_4_ = (int)auVar253._0_4_;
            auVar60._4_4_ = (int)auVar253._4_4_;
            auVar60._8_4_ = (int)auVar253._8_4_;
            auVar60._12_4_ = (int)auVar253._12_4_;
            auVar81._16_4_ = (int)auVar253._16_4_;
            auVar81._0_16_ = auVar60;
            auVar81._20_4_ = (int)auVar253._20_4_;
            auVar81._24_4_ = (int)auVar253._24_4_;
            auVar81._28_4_ = (int)auVar253._28_4_;
            auVar157 = vpslld_avx(auVar60,0x17);
            auVar106 = vpslld_avx(auVar81._16_16_,0x17);
            auVar158._8_4_ = 0x3f800000;
            auVar158._0_8_ = 0x3f8000003f800000;
            auVar158._12_4_ = 0x3f800000;
            auVar106 = vpaddd_avx(auVar106,auVar158);
            auVar157 = vpaddd_avx(auVar157,auVar158);
            auVar48._0_4_ =
                 (fVar243 + fVar201 +
                 fVar243 * fVar243 *
                 (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                   0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5)) * auVar157._0_4_ + fVar201
            ;
            auVar48._4_4_ =
                 (fVar246 + fVar202 +
                 fVar246 * fVar246 *
                 (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                   0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5)) * auVar157._4_4_ + fVar202
            ;
            auVar48._8_4_ =
                 (fVar197 + fVar247 +
                 fVar197 * fVar197 *
                 (((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) * fVar197 +
                   0.041665796) * fVar197 + 0.16666666) * fVar197 + 0.5)) * auVar157._8_4_ + fVar247
            ;
            auVar48._12_4_ =
                 (fVar200 + fVar248 +
                 fVar200 * fVar200 *
                 (((((fVar200 * 0.00019875691 + 0.0013981999) * fVar200 + 0.008333452) * fVar200 +
                   0.041665796) * fVar200 + 0.16666666) * fVar200 + 0.5)) * auVar157._12_4_ +
                 fVar248;
            auVar48._16_4_ =
                 (fVar203 + fVar249 +
                 fVar203 * fVar203 *
                 (((((fVar203 * 0.00019875691 + 0.0013981999) * fVar203 + 0.008333452) * fVar203 +
                   0.041665796) * fVar203 + 0.16666666) * fVar203 + 0.5)) * auVar106._0_4_ + fVar249
            ;
            auVar48._20_4_ =
                 (fVar204 + fVar250 +
                 fVar204 * fVar204 *
                 (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                   0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5)) * auVar106._4_4_ + fVar250
            ;
            auVar48._24_4_ =
                 (fVar205 + fVar251 +
                 fVar205 * fVar205 *
                 (((((fVar205 * 0.00019875691 + 0.0013981999) * fVar205 + 0.008333452) * fVar205 +
                   0.041665796) * fVar205 + 0.16666666) * fVar205 + 0.5)) * auVar106._8_4_ + fVar251
            ;
            auVar48._28_4_ = auVar199._28_4_ + -0.6931472 + fVar252 + -0.6931472 + fVar252;
            auVar145 = vdivps_avx(auVar53,auVar48);
            break;
          case 5:
            auVar237._8_4_ = 0x42b0c0a5;
            auVar237._0_8_ = 0x42b0c0a542b0c0a5;
            auVar237._12_4_ = 0x42b0c0a5;
            auVar237._16_4_ = 0x42b0c0a5;
            auVar237._20_4_ = 0x42b0c0a5;
            auVar237._24_4_ = 0x42b0c0a5;
            auVar237._28_4_ = 0x42b0c0a5;
            auVar253 = vminps_avx(auVar237,auVar77);
            auVar239._8_4_ = 0xc2b0c0a5;
            auVar239._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar239._12_4_ = 0xc2b0c0a5;
            auVar239._16_4_ = 0xc2b0c0a5;
            auVar239._20_4_ = 0xc2b0c0a5;
            auVar239._24_4_ = 0xc2b0c0a5;
            auVar239._28_4_ = 0xc2b0c0a5;
            auVar199 = vmaxps_avx(auVar239,auVar253);
            auVar254._8_4_ = 0x3f000000;
            auVar254._0_8_ = 0x3f0000003f000000;
            auVar254._12_4_ = 0x3f000000;
            auVar254._16_4_ = 0x3f000000;
            auVar254._20_4_ = 0x3f000000;
            auVar254._24_4_ = 0x3f000000;
            auVar254._28_4_ = 0x3f000000;
            auVar136._0_4_ = auVar199._0_4_ * 1.442695 + 0.5;
            auVar136._4_4_ = auVar199._4_4_ * 1.442695 + 0.5;
            auVar136._8_4_ = auVar199._8_4_ * 1.442695 + 0.5;
            auVar136._12_4_ = auVar199._12_4_ * 1.442695 + 0.5;
            auVar136._16_4_ = auVar199._16_4_ * 1.442695 + 0.5;
            auVar136._20_4_ = auVar199._20_4_ * 1.442695 + 0.5;
            auVar136._24_4_ = auVar199._24_4_ * 1.442695 + 0.5;
            auVar136._28_4_ = auVar145._28_4_ + 0.5;
            auVar52 = vroundps_avx(auVar136,1);
            auVar253 = vcmpps_avx(auVar136,auVar52,1);
            auVar253 = vandps_avx(auVar253,auVar53);
            auVar253 = vsubps_avx(auVar52,auVar253);
            auVar16._4_4_ = auVar253._4_4_ * 0.6931472;
            auVar16._0_4_ = auVar253._0_4_ * 0.6931472;
            auVar16._8_4_ = auVar253._8_4_ * 0.6931472;
            auVar16._12_4_ = auVar253._12_4_ * 0.6931472;
            auVar16._16_4_ = auVar253._16_4_ * 0.6931472;
            auVar16._20_4_ = auVar253._20_4_ * 0.6931472;
            auVar16._24_4_ = auVar253._24_4_ * 0.6931472;
            auVar16._28_4_ = auVar52._28_4_;
            auVar199 = vsubps_avx(auVar199,auVar16);
            fVar197 = auVar199._0_4_;
            fVar200 = auVar199._4_4_;
            fVar203 = auVar199._8_4_;
            fVar204 = auVar199._12_4_;
            fVar205 = auVar199._16_4_;
            fVar206 = auVar199._20_4_;
            fVar98 = auVar199._24_4_;
            auVar105._0_4_ = (int)auVar253._0_4_;
            auVar105._4_4_ = (int)auVar253._4_4_;
            auVar105._8_4_ = (int)auVar253._8_4_;
            auVar105._12_4_ = (int)auVar253._12_4_;
            auVar137._16_4_ = (int)auVar253._16_4_;
            auVar137._0_16_ = auVar105;
            auVar137._20_4_ = (int)auVar253._20_4_;
            auVar137._24_4_ = (int)auVar253._24_4_;
            auVar137._28_4_ = (int)auVar253._28_4_;
            auVar157 = vpslld_avx(auVar105,0x17);
            auVar106 = vpslld_avx(auVar137._16_16_,0x17);
            auVar234._8_4_ = 0x3f800000;
            auVar234._0_8_ = 0x3f8000003f800000;
            auVar234._12_4_ = 0x3f800000;
            auVar106 = vpaddd_avx(auVar234,auVar106);
            auVar157 = vpaddd_avx(auVar234,auVar157);
            auVar138._0_4_ =
                 (fVar197 + fVar201 +
                 fVar197 * fVar197 *
                 (((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) * fVar197 +
                   0.041665796) * fVar197 + 0.16666666) * fVar197 + 0.5)) * auVar157._0_4_ + fVar201
            ;
            auVar138._4_4_ =
                 (fVar200 + fVar202 +
                 fVar200 * fVar200 *
                 (((((fVar200 * 0.00019875691 + 0.0013981999) * fVar200 + 0.008333452) * fVar200 +
                   0.041665796) * fVar200 + 0.16666666) * fVar200 + 0.5)) * auVar157._4_4_ + fVar202
            ;
            auVar138._8_4_ =
                 (fVar203 + fVar247 +
                 fVar203 * fVar203 *
                 (((((fVar203 * 0.00019875691 + 0.0013981999) * fVar203 + 0.008333452) * fVar203 +
                   0.041665796) * fVar203 + 0.16666666) * fVar203 + 0.5)) * auVar157._8_4_ + fVar247
            ;
            auVar138._12_4_ =
                 (fVar204 + fVar248 +
                 fVar204 * fVar204 *
                 (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                   0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5)) * auVar157._12_4_ +
                 fVar248;
            auVar138._16_4_ =
                 (fVar205 + fVar249 +
                 fVar205 * fVar205 *
                 (((((fVar205 * 0.00019875691 + 0.0013981999) * fVar205 + 0.008333452) * fVar205 +
                   0.041665796) * fVar205 + 0.16666666) * fVar205 + 0.5)) * auVar106._0_4_ + fVar249
            ;
            auVar138._20_4_ =
                 (fVar206 + fVar250 +
                 fVar206 * fVar206 *
                 (((((fVar206 * 0.00019875691 + 0.0013981999) * fVar206 + 0.008333452) * fVar206 +
                   0.041665796) * fVar206 + 0.16666666) * fVar206 + 0.5)) * auVar106._4_4_ + fVar250
            ;
            auVar138._24_4_ =
                 (fVar98 + fVar251 +
                 fVar98 * fVar98 *
                 (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
                   0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5)) * auVar106._8_4_ + fVar251;
            auVar138._28_4_ = auVar199._28_4_ + fVar252 + auVar52._28_4_ + fVar252;
            auVar43._8_4_ = 0x800000;
            auVar43._0_8_ = 0x80000000800000;
            auVar43._12_4_ = 0x800000;
            auVar43._16_4_ = 0x800000;
            auVar43._20_4_ = 0x800000;
            auVar43._24_4_ = 0x800000;
            auVar43._28_4_ = 0x800000;
            auVar52 = vmaxps_avx(auVar138,auVar43);
            auVar106 = vpsrld_avx(auVar52._16_16_,0x17);
            auVar171._8_4_ = 0x807fffff;
            auVar171._0_8_ = 0x807fffff807fffff;
            auVar171._12_4_ = 0x807fffff;
            auVar171._16_4_ = 0x807fffff;
            auVar171._20_4_ = 0x807fffff;
            auVar171._24_4_ = 0x807fffff;
            auVar171._28_4_ = 0x807fffff;
            auVar253 = vandps_avx(auVar52,auVar171);
            auVar84 = vorps_avx(auVar254,auVar253);
            auVar212._8_4_ = 0x3f3504f3;
            auVar212._0_8_ = 0x3f3504f33f3504f3;
            auVar212._12_4_ = 0x3f3504f3;
            auVar212._16_4_ = 0x3f3504f3;
            auVar212._20_4_ = 0x3f3504f3;
            auVar212._24_4_ = 0x3f3504f3;
            auVar212._28_4_ = 0x3f3504f3;
            auVar199 = vcmpps_avx(auVar212,auVar84,2);
            auVar253 = vandnps_avx(auVar199,auVar84);
            fVar197 = auVar253._0_4_ + auVar84._0_4_ + -1.0;
            fVar200 = auVar253._4_4_ + auVar84._4_4_ + -1.0;
            fVar203 = auVar253._8_4_ + auVar84._8_4_ + -1.0;
            fVar204 = auVar253._12_4_ + auVar84._12_4_ + -1.0;
            fVar205 = auVar253._16_4_ + auVar84._16_4_ + -1.0;
            fVar206 = auVar253._20_4_ + auVar84._20_4_ + -1.0;
            fVar98 = auVar253._24_4_ + auVar84._24_4_ + -1.0;
            auVar106 = vpsubd_avx(auVar106,auVar199._16_16_);
            auVar157 = vpsrld_avx(auVar52._0_16_,0x17);
            auVar223._8_4_ = 0xffffff81;
            auVar223._0_8_ = 0xffffff81ffffff81;
            auVar223._12_4_ = 0xffffff81;
            auVar106 = vpaddd_avx(auVar223,auVar106);
            auVar157 = vpsubd_avx(auVar157,auVar199._0_16_);
            auVar157 = vpaddd_avx(auVar223,auVar157);
            auVar44._16_16_ = auVar106;
            auVar44._0_16_ = auVar157;
            auVar199 = vcmpps_avx(auVar138,_DAT_0053ad40,2);
            auVar52 = vcvtdq2ps_avx(auVar44);
            auVar17._4_4_ =
                 (auVar52._4_4_ * 0.6931472 + fVar200 +
                 fVar200 * fVar200 *
                 (((((((((fVar200 * 0.070376836 + -0.1151461) * fVar200 + 0.116769984) * fVar200 +
                       -0.12420141) * fVar200 + 0.14249323) * fVar200 + -0.16668057) * fVar200 +
                    0.20000714) * fVar200 + -0.24999994) * fVar200 + 0.3333333) * fVar200 + -0.5)) *
                 -2.0;
            auVar17._0_4_ =
                 (auVar52._0_4_ * 0.6931472 + fVar197 +
                 fVar197 * fVar197 *
                 (((((((((fVar197 * 0.070376836 + -0.1151461) * fVar197 + 0.116769984) * fVar197 +
                       -0.12420141) * fVar197 + 0.14249323) * fVar197 + -0.16668057) * fVar197 +
                    0.20000714) * fVar197 + -0.24999994) * fVar197 + 0.3333333) * fVar197 + -0.5)) *
                 -2.0;
            auVar17._8_4_ =
                 (auVar52._8_4_ * 0.6931472 + fVar203 +
                 fVar203 * fVar203 *
                 (((((((((fVar203 * 0.070376836 + -0.1151461) * fVar203 + 0.116769984) * fVar203 +
                       -0.12420141) * fVar203 + 0.14249323) * fVar203 + -0.16668057) * fVar203 +
                    0.20000714) * fVar203 + -0.24999994) * fVar203 + 0.3333333) * fVar203 + -0.5)) *
                 -2.0;
            auVar17._12_4_ =
                 (auVar52._12_4_ * 0.6931472 + fVar204 +
                 fVar204 * fVar204 *
                 (((((((((fVar204 * 0.070376836 + -0.1151461) * fVar204 + 0.116769984) * fVar204 +
                       -0.12420141) * fVar204 + 0.14249323) * fVar204 + -0.16668057) * fVar204 +
                    0.20000714) * fVar204 + -0.24999994) * fVar204 + 0.3333333) * fVar204 + -0.5)) *
                 -2.0;
            auVar17._16_4_ =
                 (auVar52._16_4_ * 0.6931472 + fVar205 +
                 fVar205 * fVar205 *
                 (((((((((fVar205 * 0.070376836 + -0.1151461) * fVar205 + 0.116769984) * fVar205 +
                       -0.12420141) * fVar205 + 0.14249323) * fVar205 + -0.16668057) * fVar205 +
                    0.20000714) * fVar205 + -0.24999994) * fVar205 + 0.3333333) * fVar205 + -0.5)) *
                 -2.0;
            auVar17._20_4_ =
                 (auVar52._20_4_ * 0.6931472 + fVar206 +
                 fVar206 * fVar206 *
                 (((((((((fVar206 * 0.070376836 + -0.1151461) * fVar206 + 0.116769984) * fVar206 +
                       -0.12420141) * fVar206 + 0.14249323) * fVar206 + -0.16668057) * fVar206 +
                    0.20000714) * fVar206 + -0.24999994) * fVar206 + 0.3333333) * fVar206 + -0.5)) *
                 -2.0;
            auVar17._24_4_ =
                 (auVar52._24_4_ * 0.6931472 + fVar98 +
                 fVar98 * fVar98 *
                 (((((((((fVar98 * 0.070376836 + -0.1151461) * fVar98 + 0.116769984) * fVar98 +
                       -0.12420141) * fVar98 + 0.14249323) * fVar98 + -0.16668057) * fVar98 +
                    0.20000714) * fVar98 + -0.24999994) * fVar98 + 0.3333333) * fVar98 + -0.5)) *
                 -2.0;
            auVar17._28_4_ = auVar52._28_4_ + auVar253._28_4_ + auVar84._28_4_ + -1.0 + 0.0;
            auVar172._8_4_ = 0x7fffffff;
            auVar172._0_8_ = 0x7fffffff7fffffff;
            auVar172._12_4_ = 0x7fffffff;
            auVar172._16_4_ = 0x7fffffff;
            auVar172._20_4_ = 0x7fffffff;
            auVar172._24_4_ = 0x7fffffff;
            auVar172._28_4_ = 0x7fffffff;
            auVar253 = vblendvps_avx(auVar17,auVar172,auVar199);
            auVar139._8_4_ = 0x42b0c0a5;
            auVar139._0_8_ = 0x42b0c0a542b0c0a5;
            auVar139._12_4_ = 0x42b0c0a5;
            auVar139._16_4_ = 0x42b0c0a5;
            auVar139._20_4_ = 0x42b0c0a5;
            auVar139._24_4_ = 0x42b0c0a5;
            auVar139._28_4_ = 0x42b0c0a5;
            auVar253 = vminps_avx(auVar253,auVar139);
            auVar140._8_4_ = 0xc2b0c0a5;
            auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar140._12_4_ = 0xc2b0c0a5;
            auVar140._16_4_ = 0xc2b0c0a5;
            auVar140._20_4_ = 0xc2b0c0a5;
            auVar140._24_4_ = 0xc2b0c0a5;
            auVar140._28_4_ = 0xc2b0c0a5;
            auVar199 = vmaxps_avx(auVar253,auVar140);
            auVar141._0_4_ = auVar199._0_4_ * 1.442695 + 0.5;
            auVar141._4_4_ = auVar199._4_4_ * 1.442695 + 0.5;
            auVar141._8_4_ = auVar199._8_4_ * 1.442695 + 0.5;
            auVar141._12_4_ = auVar199._12_4_ * 1.442695 + 0.5;
            auVar141._16_4_ = auVar199._16_4_ * 1.442695 + 0.5;
            auVar141._20_4_ = auVar199._20_4_ * 1.442695 + 0.5;
            auVar141._24_4_ = auVar199._24_4_ * 1.442695 + 0.5;
            auVar141._28_4_ = 0x3ff8aa3b;
            auVar52 = vroundps_avx(auVar141,1);
            auVar253 = vcmpps_avx(auVar141,auVar52,1);
            auVar253 = vandps_avx(auVar253,auVar53);
            auVar253 = vsubps_avx(auVar52,auVar253);
            auVar18._4_4_ = auVar253._4_4_ * 0.6931472;
            auVar18._0_4_ = auVar253._0_4_ * 0.6931472;
            auVar18._8_4_ = auVar253._8_4_ * 0.6931472;
            auVar18._12_4_ = auVar253._12_4_ * 0.6931472;
            auVar18._16_4_ = auVar253._16_4_ * 0.6931472;
            auVar18._20_4_ = auVar253._20_4_ * 0.6931472;
            auVar18._24_4_ = auVar253._24_4_ * 0.6931472;
            auVar18._28_4_ = auVar52._28_4_;
            auVar199 = vsubps_avx(auVar199,auVar18);
            fVar197 = auVar199._0_4_;
            fVar200 = auVar199._4_4_;
            fVar203 = auVar199._8_4_;
            fVar204 = auVar199._12_4_;
            fVar205 = auVar199._16_4_;
            fVar206 = auVar199._20_4_;
            fVar98 = auVar199._24_4_;
            auVar196 = ZEXT3264(auVar53);
            auVar255 = ZEXT864(0) << 0x20;
            auVar107._0_4_ = (int)auVar253._0_4_;
            auVar107._4_4_ = (int)auVar253._4_4_;
            auVar107._8_4_ = (int)auVar253._8_4_;
            auVar107._12_4_ = (int)auVar253._12_4_;
            auVar142._16_4_ = (int)auVar253._16_4_;
            auVar142._0_16_ = auVar107;
            auVar142._20_4_ = (int)auVar253._20_4_;
            auVar142._24_4_ = (int)auVar253._24_4_;
            auVar142._28_4_ = (int)auVar253._28_4_;
            auVar157 = vpslld_avx(auVar107,0x17);
            auVar106 = vpslld_avx(auVar142._16_16_,0x17);
            auVar106 = vpaddd_avx(auVar234,auVar106);
            auVar157 = vpaddd_avx(auVar234,auVar157);
            auVar45._0_4_ =
                 (fVar197 + fVar201 +
                 fVar197 * fVar197 *
                 (((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) * fVar197 +
                   0.041665796) * fVar197 + 0.16666666) * fVar197 + 0.5)) * auVar157._0_4_ + fVar201
            ;
            auVar45._4_4_ =
                 (fVar200 + fVar202 +
                 fVar200 * fVar200 *
                 (((((fVar200 * 0.00019875691 + 0.0013981999) * fVar200 + 0.008333452) * fVar200 +
                   0.041665796) * fVar200 + 0.16666666) * fVar200 + 0.5)) * auVar157._4_4_ + fVar202
            ;
            auVar45._8_4_ =
                 (fVar203 + fVar247 +
                 fVar203 * fVar203 *
                 (((((fVar203 * 0.00019875691 + 0.0013981999) * fVar203 + 0.008333452) * fVar203 +
                   0.041665796) * fVar203 + 0.16666666) * fVar203 + 0.5)) * auVar157._8_4_ + fVar247
            ;
            auVar45._12_4_ =
                 (fVar204 + fVar248 +
                 fVar204 * fVar204 *
                 (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                   0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5)) * auVar157._12_4_ +
                 fVar248;
            auVar45._16_4_ =
                 (fVar205 + fVar249 +
                 fVar205 * fVar205 *
                 (((((fVar205 * 0.00019875691 + 0.0013981999) * fVar205 + 0.008333452) * fVar205 +
                   0.041665796) * fVar205 + 0.16666666) * fVar205 + 0.5)) * auVar106._0_4_ + fVar249
            ;
            auVar45._20_4_ =
                 (fVar206 + fVar250 +
                 fVar206 * fVar206 *
                 (((((fVar206 * 0.00019875691 + 0.0013981999) * fVar206 + 0.008333452) * fVar206 +
                   0.041665796) * fVar206 + 0.16666666) * fVar206 + 0.5)) * auVar106._4_4_ + fVar250
            ;
            auVar45._24_4_ =
                 (fVar98 + fVar251 +
                 fVar98 * fVar98 *
                 (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
                   0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5)) * auVar106._8_4_ + fVar251;
            auVar45._28_4_ = auVar199._28_4_ + fVar252 + auVar52._28_4_ + fVar252;
            auVar143._8_4_ = 0x40000000;
            auVar143._0_8_ = 0x4000000040000000;
            auVar143._12_4_ = 0x40000000;
            auVar143._16_4_ = 0x40000000;
            auVar143._20_4_ = 0x40000000;
            auVar143._24_4_ = 0x40000000;
            auVar143._28_4_ = 0x40000000;
            auVar53 = vdivps_avx(auVar143,auVar45);
            auVar42._0_4_ = auVar53._0_4_ + -1.0;
            auVar42._4_4_ = auVar53._4_4_ + -1.0;
            auVar42._8_4_ = auVar53._8_4_ + -1.0;
            auVar42._12_4_ = auVar53._12_4_ + -1.0;
            auVar42._16_4_ = auVar53._16_4_ + -1.0;
            auVar42._20_4_ = auVar53._20_4_ + -1.0;
            auVar42._24_4_ = auVar53._24_4_ + -1.0;
            goto LAB_002d43ae;
          case 6:
            pfVar39 = (float *)(this->super_InnerProduct).activation_params.data;
            fVar201 = *pfVar39;
            fVar202 = pfVar39[1];
            auVar143._4_4_ = fVar202;
            auVar143._0_4_ = fVar202;
            auVar143._8_4_ = fVar202;
            auVar143._12_4_ = fVar202;
            auVar143._16_4_ = fVar202;
            auVar143._20_4_ = fVar202;
            auVar143._24_4_ = fVar202;
            auVar143._28_4_ = fVar202;
            auVar49._0_4_ = fVar201 * fVar243 + fVar202;
            auVar49._4_4_ = fVar201 * fVar246 + fVar202;
            auVar49._8_4_ = fVar201 * auVar77._8_4_ + fVar202;
            auVar49._12_4_ = fVar201 * auVar77._12_4_ + fVar202;
            auVar49._16_4_ = fVar201 * auVar77._16_4_ + fVar202;
            auVar49._20_4_ = fVar201 * auVar77._20_4_ + fVar202;
            auVar49._24_4_ = fVar201 * auVar77._24_4_ + fVar202;
            auVar49._28_4_ = fVar201 + fVar202;
            auVar253 = vmaxps_avx(auVar253,auVar49);
            auVar53 = vminps_avx(auVar253,auVar53);
            auVar42 = auVar53._0_28_;
LAB_002d43ae:
            auVar145._4_4_ = auVar42._4_4_ * fVar246;
            auVar145._0_4_ = auVar42._0_4_ * fVar243;
            auVar145._8_4_ = auVar42._8_4_ * auVar77._8_4_;
            auVar145._12_4_ = auVar42._12_4_ * auVar77._12_4_;
            auVar145._16_4_ = auVar42._16_4_ * auVar77._16_4_;
            auVar145._20_4_ = auVar42._20_4_ * auVar77._20_4_;
            auVar145._24_4_ = auVar42._24_4_ * auVar77._24_4_;
            auVar145._28_4_ = auVar143._28_4_;
          }
switchD_002d3f31_caseD_1:
          *(undefined1 (*) [32])((long)top_blob->data + uVar27 * 0x20) = auVar145;
        }
      }
    }
  }
LAB_002d59fa:
  if (piStack_100 != (int *)0x0) {
    LOCK();
    *piStack_100 = *piStack_100 + -1;
    UNLOCK();
    if (*piStack_100 == 0) {
      if (local_e8 == (Allocator *)0x0) {
        free(local_108);
      }
      else {
        (*local_e8->_vptr_Allocator[3])();
      }
    }
  }
  return local_148;
}

Assistant:

int InnerProduct_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}